

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  ulong uVar49;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  bool bVar53;
  uint uVar54;
  undefined1 uVar55;
  bool bVar56;
  undefined1 uVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar111;
  uint uVar112;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar114;
  uint uVar115;
  uint uVar116;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  uint uVar113;
  uint uVar117;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar118;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar135;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar136;
  float fVar137;
  undefined4 uVar138;
  float fVar154;
  float fVar156;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar150 [32];
  undefined1 auVar141 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  vint4 ai_2;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar204 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  vint4 ai;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  vint4 ai_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined4 uVar230;
  undefined4 uVar231;
  undefined1 auVar229 [28];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_9f4;
  undefined1 local_9a0 [16];
  undefined4 local_990;
  uint local_98c;
  float local_988;
  float local_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar49 = (ulong)(byte)PVar1;
  fVar118 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar65 = vsubps_avx(auVar65,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar191._0_4_ = fVar118 * auVar65._0_4_;
  auVar191._4_4_ = fVar118 * auVar65._4_4_;
  auVar191._8_4_ = fVar118 * auVar65._8_4_;
  auVar191._12_4_ = fVar118 * auVar65._12_4_;
  auVar119._0_4_ = fVar118 * auVar63._0_4_;
  auVar119._4_4_ = fVar118 * auVar63._4_4_;
  auVar119._8_4_ = fVar118 * auVar63._8_4_;
  auVar119._12_4_ = fVar118 * auVar63._12_4_;
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar49 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar58 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 + uVar49 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  uVar52 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar234._4_4_ = auVar119._0_4_;
  auVar234._0_4_ = auVar119._0_4_;
  auVar234._8_4_ = auVar119._0_4_;
  auVar234._12_4_ = auVar119._0_4_;
  auVar72 = vshufps_avx(auVar119,auVar119,0x55);
  auVar64 = vshufps_avx(auVar119,auVar119,0xaa);
  fVar118 = auVar64._0_4_;
  auVar166._0_4_ = fVar118 * auVar68._0_4_;
  fVar136 = auVar64._4_4_;
  auVar166._4_4_ = fVar136 * auVar68._4_4_;
  fVar154 = auVar64._8_4_;
  auVar166._8_4_ = fVar154 * auVar68._8_4_;
  fVar156 = auVar64._12_4_;
  auVar166._12_4_ = fVar156 * auVar68._12_4_;
  auVar139._0_4_ = auVar70._0_4_ * fVar118;
  auVar139._4_4_ = auVar70._4_4_ * fVar136;
  auVar139._8_4_ = auVar70._8_4_ * fVar154;
  auVar139._12_4_ = auVar70._12_4_ * fVar156;
  auVar120._0_4_ = auVar248._0_4_ * fVar118;
  auVar120._4_4_ = auVar248._4_4_ * fVar136;
  auVar120._8_4_ = auVar248._8_4_ * fVar154;
  auVar120._12_4_ = auVar248._12_4_ * fVar156;
  auVar64 = vfmadd231ps_fma(auVar166,auVar72,auVar63);
  auVar62 = vfmadd231ps_fma(auVar139,auVar72,auVar66);
  auVar72 = vfmadd231ps_fma(auVar120,auVar67,auVar72);
  auVar61 = vfmadd231ps_fma(auVar64,auVar234,auVar65);
  auVar62 = vfmadd231ps_fma(auVar62,auVar234,auVar69);
  auVar119 = vfmadd231ps_fma(auVar72,auVar71,auVar234);
  auVar235._4_4_ = auVar191._0_4_;
  auVar235._0_4_ = auVar191._0_4_;
  auVar235._8_4_ = auVar191._0_4_;
  auVar235._12_4_ = auVar191._0_4_;
  auVar72 = vshufps_avx(auVar191,auVar191,0x55);
  auVar64 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar118 = auVar64._0_4_;
  auVar237._0_4_ = fVar118 * auVar68._0_4_;
  fVar136 = auVar64._4_4_;
  auVar237._4_4_ = fVar136 * auVar68._4_4_;
  fVar154 = auVar64._8_4_;
  auVar237._8_4_ = fVar154 * auVar68._8_4_;
  fVar156 = auVar64._12_4_;
  auVar237._12_4_ = fVar156 * auVar68._12_4_;
  auVar196._0_4_ = auVar70._0_4_ * fVar118;
  auVar196._4_4_ = auVar70._4_4_ * fVar136;
  auVar196._8_4_ = auVar70._8_4_ * fVar154;
  auVar196._12_4_ = auVar70._12_4_ * fVar156;
  auVar192._0_4_ = auVar248._0_4_ * fVar118;
  auVar192._4_4_ = auVar248._4_4_ * fVar136;
  auVar192._8_4_ = auVar248._8_4_ * fVar154;
  auVar192._12_4_ = auVar248._12_4_ * fVar156;
  auVar63 = vfmadd231ps_fma(auVar237,auVar72,auVar63);
  auVar68 = vfmadd231ps_fma(auVar196,auVar72,auVar66);
  auVar66 = vfmadd231ps_fma(auVar192,auVar72,auVar67);
  auVar70 = vfmadd231ps_fma(auVar63,auVar235,auVar65);
  auVar67 = vfmadd231ps_fma(auVar68,auVar235,auVar69);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar248 = vfmadd231ps_fma(auVar66,auVar235,auVar71);
  auVar65 = vandps_avx(auVar61,auVar226);
  auVar215._8_4_ = 0x219392ef;
  auVar215._0_8_ = 0x219392ef219392ef;
  auVar215._12_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar65,auVar215,1);
  bVar53 = (bool)((byte)uVar58 & 1);
  auVar64._0_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar61._0_4_;
  bVar53 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar61._4_4_;
  bVar53 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar61._8_4_;
  bVar53 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar61._12_4_;
  auVar65 = vandps_avx(auVar62,auVar226);
  uVar58 = vcmpps_avx512vl(auVar65,auVar215,1);
  bVar53 = (bool)((byte)uVar58 & 1);
  auVar61._0_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar62._0_4_;
  bVar53 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar62._4_4_;
  bVar53 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar62._8_4_;
  bVar53 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar62._12_4_;
  auVar65 = vandps_avx(auVar119,auVar226);
  uVar58 = vcmpps_avx512vl(auVar65,auVar215,1);
  bVar53 = (bool)((byte)uVar58 & 1);
  auVar62._0_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar119._0_4_;
  bVar53 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar119._4_4_;
  bVar53 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar119._8_4_;
  bVar53 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar53 * 0x219392ef | (uint)!bVar53 * auVar119._12_4_;
  auVar63 = vrcp14ps_avx512vl(auVar64);
  auVar216._8_4_ = 0x3f800000;
  auVar216._0_8_ = 0x3f8000003f800000;
  auVar216._12_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar64,auVar63,auVar216);
  auVar69 = vfmadd132ps_fma(auVar65,auVar63,auVar63);
  auVar63 = vrcp14ps_avx512vl(auVar61);
  auVar65 = vfnmadd213ps_fma(auVar61,auVar63,auVar216);
  auVar66 = vfmadd132ps_fma(auVar65,auVar63,auVar63);
  auVar63 = vrcp14ps_avx512vl(auVar62);
  auVar65 = vfnmadd213ps_fma(auVar62,auVar63,auVar216);
  auVar71 = vfmadd132ps_fma(auVar65,auVar63,auVar63);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar65 = vpmovsxwd_avx(auVar65);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar70);
  auVar208._0_4_ = auVar69._0_4_ * auVar65._0_4_;
  auVar208._4_4_ = auVar69._4_4_ * auVar65._4_4_;
  auVar208._8_4_ = auVar69._8_4_ * auVar65._8_4_;
  auVar208._12_4_ = auVar69._12_4_ * auVar65._12_4_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar65 = vpmovsxwd_avx(auVar63);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar70);
  auVar64 = vpbroadcastd_avx512vl();
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar63 = vpmovsxwd_avx(auVar68);
  auVar167._0_4_ = auVar69._0_4_ * auVar65._0_4_;
  auVar167._4_4_ = auVar69._4_4_ * auVar65._4_4_;
  auVar167._8_4_ = auVar69._8_4_ * auVar65._8_4_;
  auVar167._12_4_ = auVar69._12_4_ * auVar65._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar49 * -2 + 6);
  auVar65 = vpmovsxwd_avx(auVar69);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar67);
  auVar217._0_4_ = auVar66._0_4_ * auVar65._0_4_;
  auVar217._4_4_ = auVar66._4_4_ * auVar65._4_4_;
  auVar217._8_4_ = auVar66._8_4_ * auVar65._8_4_;
  auVar217._12_4_ = auVar66._12_4_ * auVar65._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar63);
  auVar65 = vsubps_avx(auVar65,auVar67);
  auVar140._0_4_ = auVar66._0_4_ * auVar65._0_4_;
  auVar140._4_4_ = auVar66._4_4_ * auVar65._4_4_;
  auVar140._8_4_ = auVar66._8_4_ * auVar65._8_4_;
  auVar140._12_4_ = auVar66._12_4_ * auVar65._12_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar52 + uVar49 + 6);
  auVar65 = vpmovsxwd_avx(auVar66);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar248);
  auVar197._0_4_ = auVar71._0_4_ * auVar65._0_4_;
  auVar197._4_4_ = auVar71._4_4_ * auVar65._4_4_;
  auVar197._8_4_ = auVar71._8_4_ * auVar65._8_4_;
  auVar197._12_4_ = auVar71._12_4_ * auVar65._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar65 = vpmovsxwd_avx(auVar70);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar248);
  auVar121._0_4_ = auVar71._0_4_ * auVar65._0_4_;
  auVar121._4_4_ = auVar71._4_4_ * auVar65._4_4_;
  auVar121._8_4_ = auVar71._8_4_ * auVar65._8_4_;
  auVar121._12_4_ = auVar71._12_4_ * auVar65._12_4_;
  auVar65 = vpminsd_avx(auVar208,auVar167);
  auVar63 = vpminsd_avx(auVar217,auVar140);
  auVar65 = vmaxps_avx(auVar65,auVar63);
  auVar63 = vpminsd_avx(auVar197,auVar121);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar71._4_4_ = uVar138;
  auVar71._0_4_ = uVar138;
  auVar71._8_4_ = uVar138;
  auVar71._12_4_ = uVar138;
  auVar63 = vmaxps_avx512vl(auVar63,auVar71);
  auVar65 = vmaxps_avx(auVar65,auVar63);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar65,auVar67);
  auVar65 = vpmaxsd_avx(auVar208,auVar167);
  auVar63 = vpmaxsd_avx(auVar217,auVar140);
  auVar65 = vminps_avx(auVar65,auVar63);
  auVar63 = vpmaxsd_avx(auVar197,auVar121);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar248._4_4_ = uVar138;
  auVar248._0_4_ = uVar138;
  auVar248._8_4_ = uVar138;
  auVar248._12_4_ = uVar138;
  auVar63 = vminps_avx512vl(auVar63,auVar248);
  auVar65 = vminps_avx(auVar65,auVar63);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar65 = vmulps_avx512vl(auVar65,auVar72);
  uVar11 = vcmpps_avx512vl(local_320,auVar65,2);
  local_5e8 = vpcmpgtd_avx512vl(auVar64,_DAT_01f7fcf0);
  local_5e8 = ((byte)uVar11 & 0xf) & local_5e8;
  if ((char)local_5e8 == '\0') {
    return false;
  }
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01af4a4e:
  lVar50 = 0;
  for (uVar58 = local_5e8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar54].ptr;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar50 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar50 = *(long *)&pGVar2[1].time_range.upper;
  auVar65 = *(undefined1 (*) [16])(lVar50 + (long)p_Var3 * uVar58);
  auVar63 = *(undefined1 (*) [16])(lVar50 + (uVar58 + 1) * (long)p_Var3);
  auVar68 = *(undefined1 (*) [16])(lVar50 + (uVar58 + 2) * (long)p_Var3);
  local_5e8 = local_5e8 - 1 & local_5e8;
  auVar69 = *(undefined1 (*) [16])(lVar50 + (uVar58 + 3) * (long)p_Var3);
  if (local_5e8 != 0) {
    uVar52 = local_5e8 - 1 & local_5e8;
    for (uVar58 = local_5e8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    }
    if (uVar52 != 0) {
      for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar70 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  _local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar66 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar248 = local_3c0._0_16_;
  local_690 = vinsertps_avx512f(auVar66,auVar248,0x28);
  auVar209._0_4_ = auVar65._0_4_ + auVar63._0_4_ + auVar68._0_4_ + auVar69._0_4_;
  auVar209._4_4_ = auVar65._4_4_ + auVar63._4_4_ + auVar68._4_4_ + auVar69._4_4_;
  auVar209._8_4_ = auVar65._8_4_ + auVar63._8_4_ + auVar68._8_4_ + auVar69._8_4_;
  auVar209._12_4_ = auVar65._12_4_ + auVar63._12_4_ + auVar68._12_4_ + auVar69._12_4_;
  auVar15._8_4_ = 0x3e800000;
  auVar15._0_8_ = 0x3e8000003e800000;
  auVar15._12_4_ = 0x3e800000;
  auVar66 = vmulps_avx512vl(auVar209,auVar15);
  auVar66 = vsubps_avx(auVar66,auVar70);
  auVar66 = vdpps_avx(auVar66,local_690,0x7f);
  fVar118 = *(float *)(ray + k * 4 + 0x30);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  auVar218._4_12_ = ZEXT812(0) << 0x20;
  auVar218._0_4_ = local_6a0._0_4_;
  auVar67 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar218);
  auVar71 = vfnmadd213ss_fma(auVar67,local_6a0,ZEXT416(0x40000000));
  local_260 = auVar66._0_4_ * auVar67._0_4_ * auVar71._0_4_;
  auVar219._4_4_ = local_260;
  auVar219._0_4_ = local_260;
  auVar219._8_4_ = local_260;
  auVar219._12_4_ = local_260;
  fStack_970 = local_260;
  _local_980 = auVar219;
  fStack_96c = local_260;
  fStack_968 = local_260;
  fStack_964 = local_260;
  auVar66 = vfmadd231ps_fma(auVar70,local_690,auVar219);
  auVar66 = vblendps_avx(auVar66,ZEXT816(0) << 0x40,8);
  auVar65 = vsubps_avx(auVar65,auVar66);
  auVar68 = vsubps_avx(auVar68,auVar66);
  auVar63 = vsubps_avx(auVar63,auVar66);
  auVar69 = vsubps_avx(auVar69,auVar66);
  auVar73 = vbroadcastss_avx512vl(auVar65);
  auVar250 = ZEXT3264(auVar73);
  auVar75._8_4_ = 1;
  auVar75._0_8_ = 0x100000001;
  auVar75._12_4_ = 1;
  auVar75._16_4_ = 1;
  auVar75._20_4_ = 1;
  auVar75._24_4_ = 1;
  auVar75._28_4_ = 1;
  local_560 = ZEXT1632(auVar65);
  local_820 = vpermps_avx2(auVar75,local_560);
  auVar228 = ZEXT3264(local_820);
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  local_840 = vpermps_avx2(auVar76,local_560);
  auVar233 = ZEXT3264(local_840);
  auVar77._8_4_ = 3;
  auVar77._0_8_ = 0x300000003;
  auVar77._12_4_ = 3;
  auVar77._16_4_ = 3;
  auVar77._20_4_ = 3;
  auVar77._24_4_ = 3;
  auVar77._28_4_ = 3;
  local_880 = vpermps_avx512vl(auVar77,local_560);
  auVar249 = ZEXT3264(local_880);
  uVar138 = auVar63._0_4_;
  local_5e0._4_4_ = uVar138;
  local_5e0._0_4_ = uVar138;
  local_5e0._8_4_ = uVar138;
  local_5e0._12_4_ = uVar138;
  local_5e0._16_4_ = uVar138;
  local_5e0._20_4_ = uVar138;
  local_5e0._24_4_ = uVar138;
  local_5e0._28_4_ = uVar138;
  auVar206 = ZEXT3264(local_5e0);
  local_5a0 = ZEXT1632(auVar63);
  local_860 = vpermps_avx2(auVar75,local_5a0);
  auVar225 = ZEXT3264(local_860);
  local_8a0 = vpermps_avx2(auVar76,local_5a0);
  auVar238 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar77,local_5a0);
  auVar239 = ZEXT3264(local_8c0);
  local_8e0 = vbroadcastss_avx512vl(auVar68);
  auVar240 = ZEXT3264(local_8e0);
  local_580 = ZEXT1632(auVar68);
  local_900 = vpermps_avx512vl(auVar75,local_580);
  auVar241 = ZEXT3264(local_900);
  local_7a0 = vpermps_avx512vl(auVar76,local_580);
  auVar242 = ZEXT3264(local_7a0);
  local_920 = vpermps_avx512vl(auVar77,local_580);
  auVar243 = ZEXT3264(local_920);
  local_7c0 = vbroadcastss_avx512vl(auVar69);
  auVar244 = ZEXT3264(local_7c0);
  _local_5c0 = ZEXT1632(auVar69);
  local_940 = vpermps_avx512vl(auVar75,_local_5c0);
  auVar245 = ZEXT3264(local_940);
  local_960 = vpermps_avx512vl(auVar76,_local_5c0);
  auVar246 = ZEXT3264(local_960);
  local_7e0 = vpermps_avx512vl(auVar77,_local_5c0);
  auVar247 = ZEXT3264(local_7e0);
  auVar65 = vmulss_avx512f(auVar248,auVar248);
  auVar73 = vfmadd231ps_avx512vl(ZEXT1632(auVar65),local_3a0,local_3a0);
  local_240 = vfmadd231ps_avx512vl(auVar73,_local_380,_local_380);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73._16_4_ = 0x7fffffff;
  auVar73._20_4_ = 0x7fffffff;
  auVar73._24_4_ = 0x7fffffff;
  auVar73._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar73);
  local_640 = ZEXT416((uint)local_260);
  local_260 = fVar118 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  local_9f4 = 1;
  uVar51 = 0;
  bVar53 = false;
  local_480 = vpbroadcastd_avx512vl();
  auVar65 = vsqrtss_avx(local_6a0,local_6a0);
  local_984 = auVar65._0_4_;
  auVar65 = vsqrtss_avx(local_6a0,local_6a0);
  local_988 = auVar65._0_4_;
  local_310 = ZEXT816(0x3f80000000000000);
  do {
    auVar65 = vmovshdup_avx(local_310);
    auVar65 = vsubps_avx(auVar65,local_310);
    fVar136 = auVar65._0_4_;
    fVar135 = fVar136 * 0.04761905;
    auVar195._0_4_ = local_310._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    local_6c0._4_4_ = fVar136;
    local_6c0._0_4_ = fVar136;
    local_6c0._8_4_ = fVar136;
    local_6c0._12_4_ = fVar136;
    local_6c0._16_4_ = fVar136;
    local_6c0._20_4_ = fVar136;
    local_6c0._24_4_ = fVar136;
    local_6c0._28_4_ = fVar136;
    auVar65 = vfmadd231ps_fma(auVar195,local_6c0,_DAT_01faff20);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar73 = vsubps_avx512vl(auVar74,ZEXT1632(auVar65));
    fVar136 = auVar65._0_4_;
    fVar154 = auVar65._4_4_;
    auVar90._4_4_ = auVar206._4_4_ * fVar154;
    auVar90._0_4_ = auVar206._0_4_ * fVar136;
    fVar156 = auVar65._8_4_;
    auVar90._8_4_ = auVar206._8_4_ * fVar156;
    fVar158 = auVar65._12_4_;
    auVar90._12_4_ = auVar206._12_4_ * fVar158;
    auVar90._16_4_ = auVar206._16_4_ * 0.0;
    auVar90._20_4_ = auVar206._20_4_ * 0.0;
    auVar90._24_4_ = auVar206._24_4_ * 0.0;
    auVar90._28_4_ = DAT_01faff20._28_4_;
    auVar78._4_4_ = auVar225._4_4_ * fVar154;
    auVar78._0_4_ = auVar225._0_4_ * fVar136;
    auVar78._8_4_ = auVar225._8_4_ * fVar156;
    auVar78._12_4_ = auVar225._12_4_ * fVar158;
    auVar78._16_4_ = auVar225._16_4_ * 0.0;
    auVar78._20_4_ = auVar225._20_4_ * 0.0;
    auVar78._24_4_ = auVar225._24_4_ * 0.0;
    auVar78._28_4_ = auVar195._0_4_;
    auVar207._0_4_ = auVar238._0_4_ * fVar136;
    auVar207._4_4_ = auVar238._4_4_ * fVar154;
    auVar207._8_4_ = auVar238._8_4_ * fVar156;
    auVar207._12_4_ = auVar238._12_4_ * fVar158;
    auVar207._16_4_ = auVar238._16_4_ * 0.0;
    auVar207._20_4_ = auVar238._20_4_ * 0.0;
    auVar207._28_36_ = auVar206._28_36_;
    auVar207._24_4_ = auVar238._24_4_ * 0.0;
    auVar75 = vmulps_avx512vl(auVar239._0_32_,ZEXT1632(auVar65));
    local_700 = auVar250._0_32_;
    auVar76 = vfmadd231ps_avx512vl(auVar90,auVar73,local_700);
    auVar63 = vfmadd231ps_fma(auVar78,auVar73,auVar228._0_32_);
    auVar68 = vfmadd231ps_fma(auVar207._0_32_,auVar73,auVar233._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar249._0_32_);
    auVar77 = vmulps_avx512vl(auVar240._0_32_,ZEXT1632(auVar65));
    auVar82 = ZEXT1632(auVar65);
    auVar78 = vmulps_avx512vl(auVar241._0_32_,auVar82);
    auVar79 = vmulps_avx512vl(auVar242._0_32_,auVar82);
    auVar80 = vmulps_avx512vl(auVar243._0_32_,auVar82);
    auVar69 = vfmadd231ps_fma(auVar77,auVar73,auVar206._0_32_);
    auVar66 = vfmadd231ps_fma(auVar78,auVar73,auVar225._0_32_);
    auVar70 = vfmadd231ps_fma(auVar79,auVar73,auVar238._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar80,auVar73,auVar239._0_32_);
    auVar78 = vmulps_avx512vl(auVar244._0_32_,auVar82);
    auVar79 = vmulps_avx512vl(auVar245._0_32_,auVar82);
    auVar80 = vmulps_avx512vl(auVar246._0_32_,auVar82);
    auVar81 = vmulps_avx512vl(auVar247._0_32_,auVar82);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar240._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar241._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar73,auVar242._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar73,auVar243._0_32_);
    auVar206._28_36_ = auVar238._28_36_;
    auVar206._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * auVar69._12_4_,
                            CONCAT48(fVar156 * auVar69._8_4_,
                                     CONCAT44(fVar154 * auVar69._4_4_,fVar136 * auVar69._0_4_))));
    auVar82 = vmulps_avx512vl(auVar82,ZEXT1632(auVar66));
    auVar83 = vmulps_avx512vl(ZEXT1632(auVar65),ZEXT1632(auVar70));
    auVar84 = vmulps_avx512vl(ZEXT1632(auVar65),auVar77);
    auVar65 = vfmadd231ps_fma(auVar206._0_32_,auVar73,auVar76);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar73,ZEXT1632(auVar63));
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar73,ZEXT1632(auVar68));
    auVar85 = vfmadd231ps_avx512vl(auVar84,auVar73,auVar75);
    auVar84._4_4_ = auVar78._4_4_ * fVar154;
    auVar84._0_4_ = auVar78._0_4_ * fVar136;
    auVar84._8_4_ = auVar78._8_4_ * fVar156;
    auVar84._12_4_ = auVar78._12_4_ * fVar158;
    auVar84._16_4_ = auVar78._16_4_ * 0.0;
    auVar84._20_4_ = auVar78._20_4_ * 0.0;
    auVar84._24_4_ = auVar78._24_4_ * 0.0;
    auVar84._28_4_ = auVar75._28_4_;
    auVar86._4_4_ = auVar79._4_4_ * fVar154;
    auVar86._0_4_ = auVar79._0_4_ * fVar136;
    auVar86._8_4_ = auVar79._8_4_ * fVar156;
    auVar86._12_4_ = auVar79._12_4_ * fVar158;
    auVar86._16_4_ = auVar79._16_4_ * 0.0;
    auVar86._20_4_ = auVar79._20_4_ * 0.0;
    auVar86._24_4_ = auVar79._24_4_ * 0.0;
    auVar86._28_4_ = auVar78._28_4_;
    auVar87._4_4_ = auVar80._4_4_ * fVar154;
    auVar87._0_4_ = auVar80._0_4_ * fVar136;
    auVar87._8_4_ = auVar80._8_4_ * fVar156;
    auVar87._12_4_ = auVar80._12_4_ * fVar158;
    auVar87._16_4_ = auVar80._16_4_ * 0.0;
    auVar87._20_4_ = auVar80._20_4_ * 0.0;
    auVar87._24_4_ = auVar80._24_4_ * 0.0;
    auVar87._28_4_ = auVar79._28_4_;
    auVar88._4_4_ = auVar81._4_4_ * fVar154;
    auVar88._0_4_ = auVar81._0_4_ * fVar136;
    auVar88._8_4_ = auVar81._8_4_ * fVar156;
    auVar88._12_4_ = auVar81._12_4_ * fVar158;
    auVar88._16_4_ = auVar81._16_4_ * 0.0;
    auVar88._20_4_ = auVar81._20_4_ * 0.0;
    auVar88._24_4_ = auVar81._24_4_ * 0.0;
    auVar88._28_4_ = auVar80._28_4_;
    auVar63 = vfmadd231ps_fma(auVar84,auVar73,ZEXT1632(auVar69));
    auVar68 = vfmadd231ps_fma(auVar86,auVar73,ZEXT1632(auVar66));
    auVar69 = vfmadd231ps_fma(auVar87,auVar73,ZEXT1632(auVar70));
    auVar66 = vfmadd231ps_fma(auVar88,auVar73,auVar77);
    auVar89._28_4_ = auVar76._28_4_;
    auVar89._0_28_ =
         ZEXT1628(CONCAT412(auVar69._12_4_ * fVar158,
                            CONCAT48(auVar69._8_4_ * fVar156,
                                     CONCAT44(auVar69._4_4_ * fVar154,auVar69._0_4_ * fVar136))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar158 * auVar63._12_4_,
                                                 CONCAT48(fVar156 * auVar63._8_4_,
                                                          CONCAT44(fVar154 * auVar63._4_4_,
                                                                   fVar136 * auVar63._0_4_)))),
                              auVar73,ZEXT1632(auVar65));
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar158,
                                            CONCAT48(auVar68._8_4_ * fVar156,
                                                     CONCAT44(auVar68._4_4_ * fVar154,
                                                              auVar68._0_4_ * fVar136)))),auVar73,
                         auVar82);
    auVar86 = vfmadd231ps_avx512vl(auVar89,auVar73,auVar83);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar66._12_4_ * fVar158,
                                            CONCAT48(auVar66._8_4_ * fVar156,
                                                     CONCAT44(auVar66._4_4_ * fVar154,
                                                              auVar66._0_4_ * fVar136)))),auVar85,
                         auVar73);
    auVar73 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar65));
    auVar76 = vsubps_avx512vl(ZEXT1632(auVar68),auVar82);
    auVar77 = vsubps_avx512vl(ZEXT1632(auVar69),auVar83);
    auVar78 = vsubps_avx512vl(ZEXT1632(auVar66),auVar85);
    auVar101._0_4_ = fVar135 * auVar73._0_4_ * 3.0;
    auVar101._4_4_ = fVar135 * auVar73._4_4_ * 3.0;
    auVar101._8_4_ = fVar135 * auVar73._8_4_ * 3.0;
    auVar101._12_4_ = fVar135 * auVar73._12_4_ * 3.0;
    auVar101._16_4_ = fVar135 * auVar73._16_4_ * 3.0;
    auVar101._20_4_ = fVar135 * auVar73._20_4_ * 3.0;
    auVar101._24_4_ = fVar135 * auVar73._24_4_ * 3.0;
    auVar101._28_4_ = 0;
    auVar129._0_4_ = fVar135 * auVar76._0_4_ * 3.0;
    auVar129._4_4_ = fVar135 * auVar76._4_4_ * 3.0;
    auVar129._8_4_ = fVar135 * auVar76._8_4_ * 3.0;
    auVar129._12_4_ = fVar135 * auVar76._12_4_ * 3.0;
    auVar129._16_4_ = fVar135 * auVar76._16_4_ * 3.0;
    auVar129._20_4_ = fVar135 * auVar76._20_4_ * 3.0;
    auVar129._24_4_ = fVar135 * auVar76._24_4_ * 3.0;
    auVar129._28_4_ = 0;
    auVar85._4_4_ = fVar135 * auVar77._4_4_ * 3.0;
    auVar85._0_4_ = fVar135 * auVar77._0_4_ * 3.0;
    auVar85._8_4_ = fVar135 * auVar77._8_4_ * 3.0;
    auVar85._12_4_ = fVar135 * auVar77._12_4_ * 3.0;
    auVar85._16_4_ = fVar135 * auVar77._16_4_ * 3.0;
    auVar85._20_4_ = fVar135 * auVar77._20_4_ * 3.0;
    auVar85._24_4_ = fVar135 * auVar77._24_4_ * 3.0;
    auVar85._28_4_ = auVar81._28_4_;
    fVar136 = auVar78._0_4_ * 3.0 * fVar135;
    fVar154 = auVar78._4_4_ * 3.0 * fVar135;
    auVar93._4_4_ = fVar154;
    auVar93._0_4_ = fVar136;
    fVar156 = auVar78._8_4_ * 3.0 * fVar135;
    auVar93._8_4_ = fVar156;
    fVar158 = auVar78._12_4_ * 3.0 * fVar135;
    auVar93._12_4_ = fVar158;
    fVar160 = auVar78._16_4_ * 3.0 * fVar135;
    auVar93._16_4_ = fVar160;
    fVar162 = auVar78._20_4_ * 3.0 * fVar135;
    auVar93._20_4_ = fVar162;
    fVar164 = auVar78._24_4_ * 3.0 * fVar135;
    auVar93._24_4_ = fVar164;
    auVar93._28_4_ = fVar135;
    auVar65 = vxorps_avx512vl(auVar247._0_16_,auVar247._0_16_);
    auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01feed00,ZEXT1632(auVar65));
    auVar88 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,ZEXT1632(auVar65));
    auVar76 = ZEXT1632(auVar65);
    auVar89 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar76);
    auVar91._0_4_ = auVar75._0_4_ + fVar136;
    auVar91._4_4_ = auVar75._4_4_ + fVar154;
    auVar91._8_4_ = auVar75._8_4_ + fVar156;
    auVar91._12_4_ = auVar75._12_4_ + fVar158;
    auVar91._16_4_ = auVar75._16_4_ + fVar160;
    auVar91._20_4_ = auVar75._20_4_ + fVar162;
    auVar91._24_4_ = auVar75._24_4_ + fVar164;
    auVar91._28_4_ = auVar75._28_4_ + fVar135;
    auVar73 = vmaxps_avx(auVar75,auVar91);
    auVar79 = vminps_avx512vl(auVar75,auVar91);
    auVar80 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar76);
    auVar90 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar76);
    auVar91 = vpermt2ps_avx512vl(auVar129,_DAT_01feed00,auVar76);
    auVar98 = ZEXT1632(auVar65);
    auVar92 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar98);
    auVar75 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar98);
    auVar75 = vsubps_avx(auVar80,auVar75);
    auVar76 = vsubps_avx(auVar87,ZEXT1632(auVar70));
    auVar77 = vsubps_avx(auVar88,auVar84);
    auVar78 = vsubps_avx(auVar89,auVar86);
    auVar81 = vmulps_avx512vl(auVar77,auVar85);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar129,auVar78);
    auVar82 = vmulps_avx512vl(auVar78,auVar101);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar85,auVar76);
    auVar83 = vmulps_avx512vl(auVar76,auVar129);
    auVar83 = vfmsub231ps_avx512vl(auVar83,auVar101,auVar77);
    auVar83 = vmulps_avx512vl(auVar83,auVar83);
    auVar82 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar81);
    auVar82 = vmulps_avx512vl(auVar78,auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar77,auVar77);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar76,auVar76);
    auVar83 = vrcp14ps_avx512vl(auVar82);
    auVar93 = vfnmadd213ps_avx512vl(auVar83,auVar82,auVar74);
    auVar83 = vfmadd132ps_avx512vl(auVar93,auVar83,auVar83);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar93 = vmulps_avx512vl(auVar77,auVar92);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar78);
    auVar94 = vmulps_avx512vl(auVar78,auVar90);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar76);
    auVar95 = vmulps_avx512vl(auVar76,auVar91);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar90,auVar77);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar83 = vmulps_avx512vl(auVar93,auVar83);
    auVar81 = vmaxps_avx512vl(auVar81,auVar83);
    auVar81 = vsqrtps_avx512vl(auVar81);
    auVar83 = vmaxps_avx512vl(auVar75,auVar80);
    auVar73 = vmaxps_avx512vl(auVar73,auVar83);
    auVar83 = vaddps_avx512vl(auVar81,auVar73);
    auVar73 = vminps_avx(auVar75,auVar80);
    auVar73 = vminps_avx512vl(auVar79,auVar73);
    auVar73 = vsubps_avx512vl(auVar73,auVar81);
    auVar79._8_4_ = 0x3f800002;
    auVar79._0_8_ = 0x3f8000023f800002;
    auVar79._12_4_ = 0x3f800002;
    auVar79._16_4_ = 0x3f800002;
    auVar79._20_4_ = 0x3f800002;
    auVar79._24_4_ = 0x3f800002;
    auVar79._28_4_ = 0x3f800002;
    auVar75 = vmulps_avx512vl(auVar83,auVar79);
    auVar80._8_4_ = 0x3f7ffffc;
    auVar80._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar80._12_4_ = 0x3f7ffffc;
    auVar80._16_4_ = 0x3f7ffffc;
    auVar80._20_4_ = 0x3f7ffffc;
    auVar80._24_4_ = 0x3f7ffffc;
    auVar80._28_4_ = 0x3f7ffffc;
    local_760 = vmulps_avx512vl(auVar73,auVar80);
    auVar73 = vmulps_avx512vl(auVar75,auVar75);
    auVar75 = vrsqrt14ps_avx512vl(auVar82);
    auVar81._8_4_ = 0xbf000000;
    auVar81._0_8_ = 0xbf000000bf000000;
    auVar81._12_4_ = 0xbf000000;
    auVar81._16_4_ = 0xbf000000;
    auVar81._20_4_ = 0xbf000000;
    auVar81._24_4_ = 0xbf000000;
    auVar81._28_4_ = 0xbf000000;
    auVar79 = vmulps_avx512vl(auVar82,auVar81);
    fVar136 = auVar75._0_4_;
    fVar154 = auVar75._4_4_;
    fVar156 = auVar75._8_4_;
    fVar158 = auVar75._12_4_;
    fVar135 = auVar75._16_4_;
    fVar160 = auVar75._20_4_;
    fVar162 = auVar75._24_4_;
    auVar94._4_4_ = fVar154 * fVar154 * fVar154 * auVar79._4_4_;
    auVar94._0_4_ = fVar136 * fVar136 * fVar136 * auVar79._0_4_;
    auVar94._8_4_ = fVar156 * fVar156 * fVar156 * auVar79._8_4_;
    auVar94._12_4_ = fVar158 * fVar158 * fVar158 * auVar79._12_4_;
    auVar94._16_4_ = fVar135 * fVar135 * fVar135 * auVar79._16_4_;
    auVar94._20_4_ = fVar160 * fVar160 * fVar160 * auVar79._20_4_;
    auVar94._24_4_ = fVar162 * fVar162 * fVar162 * auVar79._24_4_;
    auVar94._28_4_ = auVar83._28_4_;
    auVar82._8_4_ = 0x3fc00000;
    auVar82._0_8_ = 0x3fc000003fc00000;
    auVar82._12_4_ = 0x3fc00000;
    auVar82._16_4_ = 0x3fc00000;
    auVar82._20_4_ = 0x3fc00000;
    auVar82._24_4_ = 0x3fc00000;
    auVar82._28_4_ = 0x3fc00000;
    auVar75 = vfmadd231ps_avx512vl(auVar94,auVar75,auVar82);
    auVar79 = vmulps_avx512vl(auVar76,auVar75);
    auVar80 = vmulps_avx512vl(auVar77,auVar75);
    auVar81 = vmulps_avx512vl(auVar78,auVar75);
    auVar204 = ZEXT1632(auVar70);
    auVar82 = vsubps_avx512vl(auVar98,auVar204);
    auVar93 = vsubps_avx512vl(auVar98,auVar84);
    auVar94 = vsubps_avx512vl(auVar98,auVar86);
    auVar83 = vmulps_avx512vl(local_3c0,auVar94);
    auVar83 = vfmadd231ps_avx512vl(auVar83,local_3a0,auVar93);
    auVar83 = vfmadd231ps_avx512vl(auVar83,_local_380,auVar82);
    auVar95 = vmulps_avx512vl(auVar94,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar93);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar82,auVar82);
    auVar96 = vmulps_avx512vl(local_3c0,auVar81);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar80,local_3a0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar79,_local_380);
    auVar81 = vmulps_avx512vl(auVar94,auVar81);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar93,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar82,auVar79);
    auVar80 = vmulps_avx512vl(auVar96,auVar96);
    auVar81 = vsubps_avx512vl(local_220,auVar80);
    auVar97 = vmulps_avx512vl(auVar96,auVar79);
    auVar83 = vsubps_avx512vl(auVar83,auVar97);
    auVar97 = vaddps_avx512vl(auVar83,auVar83);
    auVar83 = vmulps_avx512vl(auVar79,auVar79);
    local_780 = vsubps_avx512vl(auVar95,auVar83);
    auVar73 = vsubps_avx512vl(local_780,auVar73);
    local_660 = vmulps_avx512vl(auVar97,auVar97);
    auVar83._8_4_ = 0x40800000;
    auVar83._0_8_ = 0x4080000040800000;
    auVar83._12_4_ = 0x40800000;
    auVar83._16_4_ = 0x40800000;
    auVar83._20_4_ = 0x40800000;
    auVar83._24_4_ = 0x40800000;
    auVar83._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar81,auVar83);
    auVar83 = vmulps_avx512vl(_local_4c0,auVar73);
    auVar83 = vsubps_avx512vl(local_660,auVar83);
    uVar58 = vcmpps_avx512vl(auVar83,auVar98,5);
    bVar45 = (byte)uVar58;
    fVar136 = (float)local_980._0_4_;
    fVar154 = (float)local_980._4_4_;
    fVar156 = fStack_978;
    fVar158 = fStack_974;
    fVar135 = fStack_970;
    fVar160 = fStack_96c;
    fVar162 = fStack_968;
    fVar164 = fStack_964;
    if (bVar45 == 0) {
LAB_01af56f1:
      auVar228 = ZEXT3264(local_820);
      auVar233 = ZEXT3264(local_840);
      auVar249 = ZEXT3264(local_880);
      auVar206 = ZEXT3264(local_5e0);
      auVar225 = ZEXT3264(local_860);
      auVar238 = ZEXT3264(local_8a0);
      auVar239 = ZEXT3264(local_8c0);
      auVar240 = ZEXT3264(local_8e0);
      auVar241 = ZEXT3264(local_900);
      auVar242 = ZEXT3264(local_7a0);
      auVar243 = ZEXT3264(local_920);
      auVar244 = ZEXT3264(local_7c0);
      auVar245 = ZEXT3264(local_940);
      auVar246 = ZEXT3264(local_960);
      auVar247 = ZEXT3264(local_7e0);
    }
    else {
      auVar83 = vsqrtps_avx512vl(auVar83);
      auVar98 = vaddps_avx512vl(auVar81,auVar81);
      local_680 = vrcp14ps_avx512vl(auVar98);
      auVar74 = vfnmadd213ps_avx512vl(local_680,auVar98,auVar74);
      auVar95 = vfmadd132ps_avx512vl(auVar74,local_680,local_680);
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar74._16_4_ = 0x80000000;
      auVar74._20_4_ = 0x80000000;
      auVar74._24_4_ = 0x80000000;
      auVar74._28_4_ = 0x80000000;
      local_6e0 = vxorps_avx512vl(auVar97,auVar74);
      auVar74 = vsubps_avx512vl(local_6e0,auVar83);
      local_4e0 = vmulps_avx512vl(auVar74,auVar95);
      auVar83 = vsubps_avx512vl(auVar83,auVar97);
      local_500 = vmulps_avx512vl(auVar83,auVar95);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar74 = vblendmps_avx512vl(auVar83,local_4e0);
      auVar99._0_4_ = (uint)(bVar45 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar83._0_4_
      ;
      bVar56 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar56 * auVar74._4_4_ | (uint)!bVar56 * auVar83._4_4_;
      bVar56 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar56 * auVar74._8_4_ | (uint)!bVar56 * auVar83._8_4_;
      bVar56 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar99._12_4_ = (uint)bVar56 * auVar74._12_4_ | (uint)!bVar56 * auVar83._12_4_;
      bVar56 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar99._16_4_ = (uint)bVar56 * auVar74._16_4_ | (uint)!bVar56 * auVar83._16_4_;
      bVar56 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar99._20_4_ = (uint)bVar56 * auVar74._20_4_ | (uint)!bVar56 * auVar83._20_4_;
      bVar56 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar99._24_4_ = (uint)bVar56 * auVar74._24_4_ | (uint)!bVar56 * auVar83._24_4_;
      bVar56 = SUB81(uVar58 >> 7,0);
      auVar99._28_4_ = (uint)bVar56 * auVar74._28_4_ | (uint)!bVar56 * auVar83._28_4_;
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar74 = vblendmps_avx512vl(auVar83,local_500);
      auVar100._0_4_ =
           (uint)(bVar45 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar83._0_4_;
      bVar56 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar100._4_4_ = (uint)bVar56 * auVar74._4_4_ | (uint)!bVar56 * auVar83._4_4_;
      bVar56 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar100._8_4_ = (uint)bVar56 * auVar74._8_4_ | (uint)!bVar56 * auVar83._8_4_;
      bVar56 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar100._12_4_ = (uint)bVar56 * auVar74._12_4_ | (uint)!bVar56 * auVar83._12_4_;
      bVar56 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar100._16_4_ = (uint)bVar56 * auVar74._16_4_ | (uint)!bVar56 * auVar83._16_4_;
      bVar56 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar100._20_4_ = (uint)bVar56 * auVar74._20_4_ | (uint)!bVar56 * auVar83._20_4_;
      bVar56 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar100._24_4_ = (uint)bVar56 * auVar74._24_4_ | (uint)!bVar56 * auVar83._24_4_;
      bVar56 = SUB81(uVar58 >> 7,0);
      auVar100._28_4_ = (uint)bVar56 * auVar74._28_4_ | (uint)!bVar56 * auVar83._28_4_;
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar80,auVar83);
      local_520 = vmaxps_avx512vl(local_240,auVar83);
      auVar95._8_4_ = 0x36000000;
      auVar95._0_8_ = 0x3600000036000000;
      auVar95._12_4_ = 0x36000000;
      auVar95._16_4_ = 0x36000000;
      auVar95._20_4_ = 0x36000000;
      auVar95._24_4_ = 0x36000000;
      auVar95._28_4_ = 0x36000000;
      local_540 = vmulps_avx512vl(local_520,auVar95);
      vandps_avx512vl(auVar81,auVar83);
      uVar52 = vcmpps_avx512vl(local_540,local_540,1);
      uVar58 = uVar58 & uVar52;
      bVar48 = (byte)uVar58;
      if (bVar48 != 0) {
        uVar52 = vcmpps_avx512vl(auVar73,_DAT_01faff00,2);
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar81 = vblendmps_avx512vl(auVar73,auVar80);
        bVar47 = (byte)uVar52;
        uVar60 = (uint)(bVar47 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar47 & 1) * local_540._0_4_;
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar59 = (uint)bVar56 * auVar81._4_4_ | (uint)!bVar56 * local_540._4_4_;
        bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar111 = (uint)bVar56 * auVar81._8_4_ | (uint)!bVar56 * local_540._8_4_;
        bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar112 = (uint)bVar56 * auVar81._12_4_ | (uint)!bVar56 * local_540._12_4_;
        bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar113 = (uint)bVar56 * auVar81._16_4_ | (uint)!bVar56 * local_540._16_4_;
        bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar114 = (uint)bVar56 * auVar81._20_4_ | (uint)!bVar56 * local_540._20_4_;
        bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar115 = (uint)bVar56 * auVar81._24_4_ | (uint)!bVar56 * local_540._24_4_;
        bVar56 = SUB81(uVar52 >> 7,0);
        uVar116 = (uint)bVar56 * auVar81._28_4_ | (uint)!bVar56 * local_540._28_4_;
        auVar99._0_4_ = (bVar48 & 1) * uVar60 | !(bool)(bVar48 & 1) * auVar99._0_4_;
        bVar56 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar99._4_4_ = bVar56 * uVar59 | !bVar56 * auVar99._4_4_;
        bVar56 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar99._8_4_ = bVar56 * uVar111 | !bVar56 * auVar99._8_4_;
        bVar56 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar99._12_4_ = bVar56 * uVar112 | !bVar56 * auVar99._12_4_;
        bVar56 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar99._16_4_ = bVar56 * uVar113 | !bVar56 * auVar99._16_4_;
        bVar56 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar99._20_4_ = bVar56 * uVar114 | !bVar56 * auVar99._20_4_;
        bVar56 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar99._24_4_ = bVar56 * uVar115 | !bVar56 * auVar99._24_4_;
        bVar56 = SUB81(uVar58 >> 7,0);
        auVar99._28_4_ = bVar56 * uVar116 | !bVar56 * auVar99._28_4_;
        auVar73 = vblendmps_avx512vl(auVar80,auVar73);
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar10 = SUB81(uVar52 >> 7,0);
        auVar100._0_4_ =
             (uint)(bVar48 & 1) *
             ((uint)(bVar47 & 1) * auVar73._0_4_ | !(bool)(bVar47 & 1) * uVar60) |
             !(bool)(bVar48 & 1) * auVar100._0_4_;
        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar100._4_4_ =
             (uint)bVar4 * ((uint)bVar56 * auVar73._4_4_ | !bVar56 * uVar59) |
             !bVar4 * auVar100._4_4_;
        bVar56 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar100._8_4_ =
             (uint)bVar56 * ((uint)bVar5 * auVar73._8_4_ | !bVar5 * uVar111) |
             !bVar56 * auVar100._8_4_;
        bVar56 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar100._12_4_ =
             (uint)bVar56 * ((uint)bVar6 * auVar73._12_4_ | !bVar6 * uVar112) |
             !bVar56 * auVar100._12_4_;
        bVar56 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar100._16_4_ =
             (uint)bVar56 * ((uint)bVar7 * auVar73._16_4_ | !bVar7 * uVar113) |
             !bVar56 * auVar100._16_4_;
        bVar56 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar100._20_4_ =
             (uint)bVar56 * ((uint)bVar8 * auVar73._20_4_ | !bVar8 * uVar114) |
             !bVar56 * auVar100._20_4_;
        bVar56 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar100._24_4_ =
             (uint)bVar56 * ((uint)bVar9 * auVar73._24_4_ | !bVar9 * uVar115) |
             !bVar56 * auVar100._24_4_;
        bVar56 = SUB81(uVar58 >> 7,0);
        auVar100._28_4_ =
             (uint)bVar56 * ((uint)bVar10 * auVar73._28_4_ | !bVar10 * uVar116) |
             !bVar56 * auVar100._28_4_;
        bVar45 = (~bVar48 | bVar47) & bVar45;
      }
      if ((bVar45 & 0x7f) == 0) goto LAB_01af56f1;
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar80 = vxorps_avx512vl(auVar92,auVar73);
      auVar81 = vxorps_avx512vl(auVar90,auVar73);
      uVar60 = *(uint *)(ray + k * 4 + 0x80);
      auVar83 = vxorps_avx512vl(auVar91,auVar73);
      auVar65 = vsubss_avx512f(ZEXT416(uVar60),ZEXT416((uint)local_640._0_4_));
      auVar90 = vbroadcastss_avx512vl(auVar65);
      auVar90 = vminps_avx512vl(auVar90,auVar100);
      auVar44._4_4_ = fStack_25c;
      auVar44._0_4_ = local_260;
      auVar44._8_4_ = fStack_258;
      auVar44._12_4_ = fStack_254;
      auVar44._16_4_ = fStack_250;
      auVar44._20_4_ = fStack_24c;
      auVar44._24_4_ = fStack_248;
      auVar44._28_4_ = fStack_244;
      auVar74 = vmaxps_avx512vl(auVar44,auVar99);
      auVar94 = vmulps_avx512vl(auVar94,auVar85);
      auVar93 = vfmadd213ps_avx512vl(auVar93,auVar129,auVar94);
      auVar65 = vfmadd213ps_fma(auVar82,auVar101,auVar93);
      auVar82 = vmulps_avx512vl(local_3c0,auVar85);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_3a0,auVar129);
      auVar63 = vfmadd231ps_fma(auVar82,_local_380,auVar101);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar63),auVar82);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar11 = vcmpps_avx512vl(auVar82,auVar85,1);
      auVar93 = vxorps_avx512vl(ZEXT1632(auVar65),auVar73);
      auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar63));
      auVar129 = ZEXT1632(auVar63);
      auVar91 = vxorps_avx512vl(auVar129,auVar73);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar129,auVar95);
      auVar65 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
      fVar137 = auVar65._0_4_ * auVar93._0_4_;
      fVar155 = auVar65._4_4_ * auVar93._4_4_;
      auVar92._4_4_ = fVar155;
      auVar92._0_4_ = fVar137;
      fVar157 = auVar65._8_4_ * auVar93._8_4_;
      auVar92._8_4_ = fVar157;
      fVar159 = auVar65._12_4_ * auVar93._12_4_;
      auVar92._12_4_ = fVar159;
      fVar161 = auVar93._16_4_ * 0.0;
      auVar92._16_4_ = fVar161;
      fVar163 = auVar93._20_4_ * 0.0;
      auVar92._20_4_ = fVar163;
      fVar165 = auVar93._24_4_ * 0.0;
      auVar92._24_4_ = fVar165;
      auVar92._28_4_ = auVar93._28_4_;
      uVar12 = vcmpps_avx512vl(auVar129,auVar91,1);
      bVar48 = (byte)uVar11 | (byte)uVar12;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar92 = vblendmps_avx512vl(auVar92,auVar101);
      auVar102._0_4_ =
           (uint)(bVar48 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar94._0_4_;
      bVar56 = (bool)(bVar48 >> 1 & 1);
      auVar102._4_4_ = (uint)bVar56 * auVar92._4_4_ | (uint)!bVar56 * auVar94._4_4_;
      bVar56 = (bool)(bVar48 >> 2 & 1);
      auVar102._8_4_ = (uint)bVar56 * auVar92._8_4_ | (uint)!bVar56 * auVar94._8_4_;
      bVar56 = (bool)(bVar48 >> 3 & 1);
      auVar102._12_4_ = (uint)bVar56 * auVar92._12_4_ | (uint)!bVar56 * auVar94._12_4_;
      bVar56 = (bool)(bVar48 >> 4 & 1);
      auVar102._16_4_ = (uint)bVar56 * auVar92._16_4_ | (uint)!bVar56 * auVar94._16_4_;
      bVar56 = (bool)(bVar48 >> 5 & 1);
      auVar102._20_4_ = (uint)bVar56 * auVar92._20_4_ | (uint)!bVar56 * auVar94._20_4_;
      bVar56 = (bool)(bVar48 >> 6 & 1);
      auVar102._24_4_ = (uint)bVar56 * auVar92._24_4_ | (uint)!bVar56 * auVar94._24_4_;
      auVar102._28_4_ =
           (uint)(bVar48 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar48 >> 7) * auVar94._28_4_;
      auVar94 = vmaxps_avx512vl(auVar74,auVar102);
      uVar12 = vcmpps_avx512vl(auVar129,auVar91,6);
      bVar48 = (byte)uVar11 | (byte)uVar12;
      auVar103._0_4_ = (uint)(bVar48 & 1) * 0x7f800000 | (uint)!(bool)(bVar48 & 1) * (int)fVar137;
      bVar56 = (bool)(bVar48 >> 1 & 1);
      auVar103._4_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar155;
      bVar56 = (bool)(bVar48 >> 2 & 1);
      auVar103._8_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar157;
      bVar56 = (bool)(bVar48 >> 3 & 1);
      auVar103._12_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar159;
      bVar56 = (bool)(bVar48 >> 4 & 1);
      auVar103._16_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar161;
      bVar56 = (bool)(bVar48 >> 5 & 1);
      auVar103._20_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar163;
      bVar56 = (bool)(bVar48 >> 6 & 1);
      auVar103._24_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar165;
      auVar103._28_4_ =
           (uint)(bVar48 >> 7) * 0x7f800000 | (uint)!(bool)(bVar48 >> 7) * auVar93._28_4_;
      auVar93 = vminps_avx512vl(auVar90,auVar103);
      auVar65 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar65),auVar87);
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar65),auVar88);
      auVar74 = ZEXT1632(auVar65);
      auVar89 = vsubps_avx512vl(auVar74,auVar89);
      auVar89 = vmulps_avx512vl(auVar89,auVar80);
      auVar88 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar88);
      auVar87 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar87);
      auVar80 = vmulps_avx512vl(local_3c0,auVar80);
      auVar80 = vfmadd231ps_avx512vl(auVar80,local_3a0,auVar83);
      auVar80 = vfmadd231ps_avx512vl(auVar80,_local_380,auVar81);
      vandps_avx512vl(auVar80,auVar82);
      uVar11 = vcmpps_avx512vl(auVar80,auVar85,1);
      auVar81 = vxorps_avx512vl(auVar87,auVar73);
      auVar82 = vrcp14ps_avx512vl(auVar80);
      auVar73 = vxorps_avx512vl(auVar80,auVar73);
      auVar83 = vfnmadd213ps_avx512vl(auVar82,auVar80,auVar95);
      auVar65 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
      fVar137 = auVar65._0_4_ * auVar81._0_4_;
      fVar155 = auVar65._4_4_ * auVar81._4_4_;
      auVar30._4_4_ = fVar155;
      auVar30._0_4_ = fVar137;
      fVar157 = auVar65._8_4_ * auVar81._8_4_;
      auVar30._8_4_ = fVar157;
      fVar159 = auVar65._12_4_ * auVar81._12_4_;
      auVar30._12_4_ = fVar159;
      fVar161 = auVar81._16_4_ * 0.0;
      auVar30._16_4_ = fVar161;
      fVar163 = auVar81._20_4_ * 0.0;
      auVar30._20_4_ = fVar163;
      fVar165 = auVar81._24_4_ * 0.0;
      auVar30._24_4_ = fVar165;
      auVar30._28_4_ = auVar81._28_4_;
      uVar12 = vcmpps_avx512vl(auVar80,auVar73,1);
      bVar48 = (byte)uVar11 | (byte)uVar12;
      auVar83 = vblendmps_avx512vl(auVar30,auVar101);
      auVar104._0_4_ =
           (uint)(bVar48 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar82._0_4_;
      bVar56 = (bool)(bVar48 >> 1 & 1);
      auVar104._4_4_ = (uint)bVar56 * auVar83._4_4_ | (uint)!bVar56 * auVar82._4_4_;
      bVar56 = (bool)(bVar48 >> 2 & 1);
      auVar104._8_4_ = (uint)bVar56 * auVar83._8_4_ | (uint)!bVar56 * auVar82._8_4_;
      bVar56 = (bool)(bVar48 >> 3 & 1);
      auVar104._12_4_ = (uint)bVar56 * auVar83._12_4_ | (uint)!bVar56 * auVar82._12_4_;
      bVar56 = (bool)(bVar48 >> 4 & 1);
      auVar104._16_4_ = (uint)bVar56 * auVar83._16_4_ | (uint)!bVar56 * auVar82._16_4_;
      bVar56 = (bool)(bVar48 >> 5 & 1);
      auVar104._20_4_ = (uint)bVar56 * auVar83._20_4_ | (uint)!bVar56 * auVar82._20_4_;
      bVar56 = (bool)(bVar48 >> 6 & 1);
      auVar104._24_4_ = (uint)bVar56 * auVar83._24_4_ | (uint)!bVar56 * auVar82._24_4_;
      auVar104._28_4_ =
           (uint)(bVar48 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar48 >> 7) * auVar82._28_4_;
      _local_800 = vmaxps_avx(auVar94,auVar104);
      uVar12 = vcmpps_avx512vl(auVar80,auVar73,6);
      bVar48 = (byte)uVar11 | (byte)uVar12;
      auVar105._0_4_ = (uint)(bVar48 & 1) * 0x7f800000 | (uint)!(bool)(bVar48 & 1) * (int)fVar137;
      bVar56 = (bool)(bVar48 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar155;
      bVar56 = (bool)(bVar48 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar157;
      bVar56 = (bool)(bVar48 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar159;
      bVar56 = (bool)(bVar48 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar161;
      bVar56 = (bool)(bVar48 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar163;
      bVar56 = (bool)(bVar48 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar56 * 0x7f800000 | (uint)!bVar56 * (int)fVar165;
      auVar105._28_4_ =
           (uint)(bVar48 >> 7) * 0x7f800000 | (uint)!(bool)(bVar48 >> 7) * auVar81._28_4_;
      local_2c0 = vminps_avx(auVar93,auVar105);
      uVar11 = vcmpps_avx512vl(_local_800,local_2c0,2);
      bVar45 = bVar45 & 0x7f & (byte)uVar11;
      if (bVar45 == 0) {
        auVar250 = ZEXT3264(local_700);
        goto LAB_01af56f1;
      }
      auVar80 = vmaxps_avx512vl(auVar74,local_760);
      auVar73 = vfmadd213ps_avx512vl(local_4e0,auVar96,auVar79);
      fVar137 = auVar75._0_4_;
      fVar155 = auVar75._4_4_;
      auVar31._4_4_ = fVar155 * auVar73._4_4_;
      auVar31._0_4_ = fVar137 * auVar73._0_4_;
      fVar157 = auVar75._8_4_;
      auVar31._8_4_ = fVar157 * auVar73._8_4_;
      fVar159 = auVar75._12_4_;
      auVar31._12_4_ = fVar159 * auVar73._12_4_;
      fVar161 = auVar75._16_4_;
      auVar31._16_4_ = fVar161 * auVar73._16_4_;
      fVar163 = auVar75._20_4_;
      auVar31._20_4_ = fVar163 * auVar73._20_4_;
      fVar165 = auVar75._24_4_;
      auVar31._24_4_ = fVar165 * auVar73._24_4_;
      auVar31._28_4_ = auVar73._28_4_;
      auVar73 = vfmadd213ps_avx512vl(local_500,auVar96,auVar79);
      auVar32._4_4_ = fVar155 * auVar73._4_4_;
      auVar32._0_4_ = fVar137 * auVar73._0_4_;
      auVar32._8_4_ = fVar157 * auVar73._8_4_;
      auVar32._12_4_ = fVar159 * auVar73._12_4_;
      auVar32._16_4_ = fVar161 * auVar73._16_4_;
      auVar32._20_4_ = fVar163 * auVar73._20_4_;
      auVar32._24_4_ = fVar165 * auVar73._24_4_;
      auVar32._28_4_ = auVar104._28_4_;
      auVar73 = vminps_avx512vl(auVar31,auVar95);
      auVar40 = ZEXT812(0);
      auVar81 = ZEXT1232(auVar40) << 0x20;
      auVar73 = vmaxps_avx(auVar73,ZEXT1232(auVar40) << 0x20);
      auVar82 = vminps_avx512vl(auVar32,auVar95);
      auVar33._4_4_ = (auVar73._4_4_ + 1.0) * 0.125;
      auVar33._0_4_ = (auVar73._0_4_ + 0.0) * 0.125;
      auVar33._8_4_ = (auVar73._8_4_ + 2.0) * 0.125;
      auVar33._12_4_ = (auVar73._12_4_ + 3.0) * 0.125;
      auVar33._16_4_ = (auVar73._16_4_ + 4.0) * 0.125;
      auVar33._20_4_ = (auVar73._20_4_ + 5.0) * 0.125;
      auVar33._24_4_ = (auVar73._24_4_ + 6.0) * 0.125;
      auVar33._28_4_ = auVar73._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar33,local_6c0,auVar195);
      local_1e0 = ZEXT1632(auVar65);
      auVar73 = vmaxps_avx(auVar82,ZEXT1232(auVar40) << 0x20);
      auVar34._4_4_ = (auVar73._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar73._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar73._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar73._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar73._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar73._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar73._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar73._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar34,local_6c0,auVar195);
      local_200 = ZEXT1632(auVar65);
      auVar35._4_4_ = auVar80._4_4_ * auVar80._4_4_;
      auVar35._0_4_ = auVar80._0_4_ * auVar80._0_4_;
      auVar35._8_4_ = auVar80._8_4_ * auVar80._8_4_;
      auVar35._12_4_ = auVar80._12_4_ * auVar80._12_4_;
      auVar35._16_4_ = auVar80._16_4_ * auVar80._16_4_;
      auVar35._20_4_ = auVar80._20_4_ * auVar80._20_4_;
      auVar35._24_4_ = auVar80._24_4_ * auVar80._24_4_;
      auVar35._28_4_ = auVar80._28_4_;
      auVar73 = vsubps_avx(local_780,auVar35);
      auVar36._4_4_ = auVar73._4_4_ * (float)local_4c0._4_4_;
      auVar36._0_4_ = auVar73._0_4_ * (float)local_4c0._0_4_;
      auVar36._8_4_ = auVar73._8_4_ * fStack_4b8;
      auVar36._12_4_ = auVar73._12_4_ * fStack_4b4;
      auVar36._16_4_ = auVar73._16_4_ * fStack_4b0;
      auVar36._20_4_ = auVar73._20_4_ * fStack_4ac;
      auVar36._24_4_ = auVar73._24_4_ * fStack_4a8;
      auVar36._28_4_ = auVar80._28_4_;
      auVar80 = vsubps_avx(local_660,auVar36);
      uVar58 = vcmpps_avx512vl(auVar80,ZEXT1232(auVar40) << 0x20,5);
      auVar250 = ZEXT3264(local_700);
      auVar247 = ZEXT3264(local_7e0);
      if ((byte)uVar58 == 0) {
        uVar58 = 0;
        auVar75 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar206 = ZEXT864(0) << 0x20;
        auVar80 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar82 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar229 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar96._8_4_ = 0x7f800000;
        auVar96._0_8_ = 0x7f8000007f800000;
        auVar96._12_4_ = 0x7f800000;
        auVar96._16_4_ = 0x7f800000;
        auVar96._20_4_ = 0x7f800000;
        auVar96._24_4_ = 0x7f800000;
        auVar96._28_4_ = 0x7f800000;
        auVar97._8_4_ = 0xff800000;
        auVar97._0_8_ = 0xff800000ff800000;
        auVar97._12_4_ = 0xff800000;
        auVar97._16_4_ = 0xff800000;
        auVar97._20_4_ = 0xff800000;
        auVar97._24_4_ = 0xff800000;
        auVar97._28_4_ = 0xff800000;
      }
      else {
        auVar63 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
        uVar52 = vcmpps_avx512vl(auVar80,auVar74,5);
        auVar80 = vsqrtps_avx(auVar80);
        auVar81 = vfnmadd213ps_avx512vl(auVar98,local_680,auVar95);
        auVar83 = vfmadd132ps_avx512vl(auVar81,local_680,local_680);
        auVar81 = vsubps_avx(local_6e0,auVar80);
        auVar87 = vmulps_avx512vl(auVar81,auVar83);
        auVar80 = vsubps_avx512vl(auVar80,auVar97);
        auVar83 = vmulps_avx512vl(auVar80,auVar83);
        auVar80 = vfmadd213ps_avx512vl(auVar96,auVar87,auVar79);
        auVar98._4_4_ = fVar155 * auVar80._4_4_;
        auVar98._0_4_ = fVar137 * auVar80._0_4_;
        auVar98._8_4_ = fVar157 * auVar80._8_4_;
        auVar98._12_4_ = fVar159 * auVar80._12_4_;
        auVar98._16_4_ = fVar161 * auVar80._16_4_;
        auVar98._20_4_ = fVar163 * auVar80._20_4_;
        auVar98._24_4_ = fVar165 * auVar80._24_4_;
        auVar98._28_4_ = auVar82._28_4_;
        auVar37._4_4_ = (float)local_380._4_4_ * auVar87._4_4_;
        auVar37._0_4_ = (float)local_380._0_4_ * auVar87._0_4_;
        auVar37._8_4_ = fStack_378 * auVar87._8_4_;
        auVar37._12_4_ = fStack_374 * auVar87._12_4_;
        auVar37._16_4_ = fStack_370 * auVar87._16_4_;
        auVar37._20_4_ = fStack_36c * auVar87._20_4_;
        auVar37._24_4_ = fStack_368 * auVar87._24_4_;
        auVar37._28_4_ = auVar80._28_4_;
        auVar81 = vmulps_avx512vl(local_3a0,auVar87);
        auVar88 = vmulps_avx512vl(local_3c0,auVar87);
        auVar80 = vfmadd213ps_avx512vl(auVar76,auVar98,auVar204);
        auVar80 = vsubps_avx512vl(auVar37,auVar80);
        auVar82 = vfmadd213ps_avx512vl(auVar77,auVar98,auVar84);
        auVar82 = vsubps_avx512vl(auVar81,auVar82);
        auVar65 = vfmadd213ps_fma(auVar98,auVar78,auVar86);
        auVar81 = vsubps_avx(auVar88,ZEXT1632(auVar65));
        auVar229 = auVar81._0_28_;
        auVar79 = vfmadd213ps_avx512vl(auVar96,auVar83,auVar79);
        auVar79 = vmulps_avx512vl(auVar75,auVar79);
        auVar38._4_4_ = (float)local_380._4_4_ * auVar83._4_4_;
        auVar38._0_4_ = (float)local_380._0_4_ * auVar83._0_4_;
        auVar38._8_4_ = fStack_378 * auVar83._8_4_;
        auVar38._12_4_ = fStack_374 * auVar83._12_4_;
        auVar38._16_4_ = fStack_370 * auVar83._16_4_;
        auVar38._20_4_ = fStack_36c * auVar83._20_4_;
        auVar38._24_4_ = fStack_368 * auVar83._24_4_;
        auVar38._28_4_ = auVar88._28_4_;
        auVar75 = vmulps_avx512vl(local_3a0,auVar83);
        auVar88 = vmulps_avx512vl(local_3c0,auVar83);
        auVar65 = vfmadd213ps_fma(auVar76,auVar79,auVar204);
        auVar81 = vsubps_avx(auVar38,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar77,auVar79,auVar84);
        auVar75 = vsubps_avx512vl(auVar75,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar78,auVar79,auVar86);
        auVar76 = vsubps_avx512vl(auVar88,ZEXT1632(auVar65));
        auVar206 = ZEXT3264(auVar76);
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar76 = vblendmps_avx512vl(auVar187,auVar87);
        bVar56 = (bool)((byte)uVar52 & 1);
        auVar96._0_4_ = (uint)bVar56 * auVar76._0_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        auVar96._4_4_ = (uint)bVar56 * auVar76._4_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
        auVar96._8_4_ = (uint)bVar56 * auVar76._8_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
        auVar96._12_4_ = (uint)bVar56 * auVar76._12_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
        auVar96._16_4_ = (uint)bVar56 * auVar76._16_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
        auVar96._20_4_ = (uint)bVar56 * auVar76._20_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
        auVar96._24_4_ = (uint)bVar56 * auVar76._24_4_ | (uint)!bVar56 * 0x7f800000;
        bVar56 = SUB81(uVar52 >> 7,0);
        auVar96._28_4_ = (uint)bVar56 * auVar76._28_4_ | (uint)!bVar56 * 0x7f800000;
        auVar205._8_4_ = 0xff800000;
        auVar205._0_8_ = 0xff800000ff800000;
        auVar205._12_4_ = 0xff800000;
        auVar205._16_4_ = 0xff800000;
        auVar205._20_4_ = 0xff800000;
        auVar205._24_4_ = 0xff800000;
        auVar205._28_4_ = 0xff800000;
        auVar76 = vblendmps_avx512vl(auVar205,auVar83);
        bVar56 = (bool)((byte)uVar52 & 1);
        auVar97._0_4_ = (uint)bVar56 * auVar76._0_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        auVar97._4_4_ = (uint)bVar56 * auVar76._4_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
        auVar97._8_4_ = (uint)bVar56 * auVar76._8_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
        auVar97._12_4_ = (uint)bVar56 * auVar76._12_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
        auVar97._16_4_ = (uint)bVar56 * auVar76._16_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
        auVar97._20_4_ = (uint)bVar56 * auVar76._20_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
        auVar97._24_4_ = (uint)bVar56 * auVar76._24_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = SUB81(uVar52 >> 7,0);
        auVar97._28_4_ = (uint)bVar56 * auVar76._28_4_ | (uint)!bVar56 * -0x800000;
        auVar204._8_4_ = 0x36000000;
        auVar204._0_8_ = 0x3600000036000000;
        auVar204._12_4_ = 0x36000000;
        auVar204._16_4_ = 0x36000000;
        auVar204._20_4_ = 0x36000000;
        auVar204._24_4_ = 0x36000000;
        auVar204._28_4_ = 0x36000000;
        auVar76 = vmulps_avx512vl(local_520,auVar204);
        uVar49 = vcmpps_avx512vl(auVar76,local_540,0xe);
        uVar52 = uVar52 & uVar49;
        bVar48 = (byte)uVar52;
        if (bVar48 != 0) {
          uVar49 = vcmpps_avx512vl(auVar73,ZEXT1632(auVar63),2);
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar232._8_4_ = 0xff800000;
          auVar232._0_8_ = 0xff800000ff800000;
          auVar232._12_4_ = 0xff800000;
          auVar232._16_4_ = 0xff800000;
          auVar232._20_4_ = 0xff800000;
          auVar232._24_4_ = 0xff800000;
          auVar232._28_4_ = 0xff800000;
          auVar73 = vblendmps_avx512vl(auVar227,auVar232);
          bVar47 = (byte)uVar49;
          uVar59 = (uint)(bVar47 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar76._0_4_;
          bVar56 = (bool)((byte)(uVar49 >> 1) & 1);
          uVar111 = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * auVar76._4_4_;
          bVar56 = (bool)((byte)(uVar49 >> 2) & 1);
          uVar112 = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * auVar76._8_4_;
          bVar56 = (bool)((byte)(uVar49 >> 3) & 1);
          uVar113 = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * auVar76._12_4_;
          bVar56 = (bool)((byte)(uVar49 >> 4) & 1);
          uVar114 = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * auVar76._16_4_;
          bVar56 = (bool)((byte)(uVar49 >> 5) & 1);
          uVar115 = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * auVar76._20_4_;
          bVar56 = (bool)((byte)(uVar49 >> 6) & 1);
          uVar116 = (uint)bVar56 * auVar73._24_4_ | (uint)!bVar56 * auVar76._24_4_;
          bVar56 = SUB81(uVar49 >> 7,0);
          uVar117 = (uint)bVar56 * auVar73._28_4_ | (uint)!bVar56 * auVar76._28_4_;
          auVar96._0_4_ = (bVar48 & 1) * uVar59 | !(bool)(bVar48 & 1) * auVar96._0_4_;
          bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
          auVar96._4_4_ = bVar56 * uVar111 | !bVar56 * auVar96._4_4_;
          bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
          auVar96._8_4_ = bVar56 * uVar112 | !bVar56 * auVar96._8_4_;
          bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
          auVar96._12_4_ = bVar56 * uVar113 | !bVar56 * auVar96._12_4_;
          bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
          auVar96._16_4_ = bVar56 * uVar114 | !bVar56 * auVar96._16_4_;
          bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
          auVar96._20_4_ = bVar56 * uVar115 | !bVar56 * auVar96._20_4_;
          bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
          auVar96._24_4_ = bVar56 * uVar116 | !bVar56 * auVar96._24_4_;
          bVar56 = SUB81(uVar52 >> 7,0);
          auVar96._28_4_ = bVar56 * uVar117 | !bVar56 * auVar96._28_4_;
          auVar73 = vblendmps_avx512vl(auVar232,auVar227);
          bVar56 = (bool)((byte)(uVar49 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar49 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar49 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar49 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar49 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar49 >> 6) & 1);
          bVar10 = SUB81(uVar49 >> 7,0);
          auVar97._0_4_ =
               (uint)(bVar48 & 1) *
               ((uint)(bVar47 & 1) * auVar73._0_4_ | !(bool)(bVar47 & 1) * uVar59) |
               !(bool)(bVar48 & 1) * auVar97._0_4_;
          bVar4 = (bool)((byte)(uVar52 >> 1) & 1);
          auVar97._4_4_ =
               (uint)bVar4 * ((uint)bVar56 * auVar73._4_4_ | !bVar56 * uVar111) |
               !bVar4 * auVar97._4_4_;
          bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
          auVar97._8_4_ =
               (uint)bVar56 * ((uint)bVar5 * auVar73._8_4_ | !bVar5 * uVar112) |
               !bVar56 * auVar97._8_4_;
          bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
          auVar97._12_4_ =
               (uint)bVar56 * ((uint)bVar6 * auVar73._12_4_ | !bVar6 * uVar113) |
               !bVar56 * auVar97._12_4_;
          bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
          auVar97._16_4_ =
               (uint)bVar56 * ((uint)bVar7 * auVar73._16_4_ | !bVar7 * uVar114) |
               !bVar56 * auVar97._16_4_;
          bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
          auVar97._20_4_ =
               (uint)bVar56 * ((uint)bVar8 * auVar73._20_4_ | !bVar8 * uVar115) |
               !bVar56 * auVar97._20_4_;
          bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
          auVar97._24_4_ =
               (uint)bVar56 * ((uint)bVar9 * auVar73._24_4_ | !bVar9 * uVar116) |
               !bVar56 * auVar97._24_4_;
          bVar56 = SUB81(uVar52 >> 7,0);
          auVar97._28_4_ =
               (uint)bVar56 * ((uint)bVar10 * auVar73._28_4_ | !bVar10 * uVar117) |
               !bVar56 * auVar97._28_4_;
          uVar58 = (ulong)(byte)((~bVar48 | bVar47) & (byte)uVar58);
        }
      }
      auVar249 = ZEXT3264(local_880);
      auVar238 = ZEXT3264(local_8a0);
      auVar239 = ZEXT3264(local_8c0);
      auVar240 = ZEXT3264(local_8e0);
      auVar241 = ZEXT3264(local_900);
      auVar243 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      auVar246 = ZEXT3264(local_960);
      auVar225._0_4_ = local_3c0._0_4_ * auVar206._0_4_;
      auVar225._4_4_ = local_3c0._4_4_ * auVar206._4_4_;
      auVar225._8_4_ = local_3c0._8_4_ * auVar206._8_4_;
      auVar225._12_4_ = local_3c0._12_4_ * auVar206._12_4_;
      auVar225._16_4_ = local_3c0._16_4_ * auVar206._16_4_;
      auVar225._20_4_ = local_3c0._20_4_ * auVar206._20_4_;
      auVar225._28_36_ = auVar206._28_36_;
      auVar225._24_4_ = local_3c0._24_4_ * auVar206._24_4_;
      auVar65 = vfmadd231ps_fma(auVar225._0_32_,local_3a0,auVar75);
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),_local_380,auVar81);
      auVar224._8_4_ = 0x7fffffff;
      auVar224._0_8_ = 0x7fffffff7fffffff;
      auVar224._12_4_ = 0x7fffffff;
      auVar224._16_4_ = 0x7fffffff;
      auVar224._20_4_ = 0x7fffffff;
      auVar224._24_4_ = 0x7fffffff;
      auVar224._28_4_ = 0x7fffffff;
      auVar73 = vandps_avx(ZEXT1632(auVar65),auVar224);
      _local_1c0 = _local_800;
      auVar214._8_4_ = 0x3e99999a;
      auVar214._0_8_ = 0x3e99999a3e99999a;
      auVar214._12_4_ = 0x3e99999a;
      auVar214._16_4_ = 0x3e99999a;
      auVar214._20_4_ = 0x3e99999a;
      auVar214._24_4_ = 0x3e99999a;
      auVar214._28_4_ = 0x3e99999a;
      uVar11 = vcmpps_avx512vl(auVar73,auVar214,1);
      local_360._0_2_ = (short)uVar11;
      local_2e0 = vmaxps_avx(_local_800,auVar97);
      auVar73 = vminps_avx(local_2c0,auVar96);
      uVar11 = vcmpps_avx512vl(_local_800,auVar73,2);
      bVar48 = (byte)uVar11 & bVar45;
      uVar12 = vcmpps_avx512vl(local_2e0,local_2c0,2);
      auVar242 = ZEXT3264(local_7a0);
      auVar244 = ZEXT3264(local_7c0);
      if ((bVar45 & ((byte)uVar12 | (byte)uVar11)) == 0) {
        auVar228 = ZEXT3264(local_820);
        auVar233 = ZEXT3264(local_840);
        auVar206 = ZEXT3264(local_5e0);
        auVar225 = ZEXT3264(local_860);
      }
      else {
        auVar39._4_4_ = local_3c0._4_4_ * auVar229._4_4_;
        auVar39._0_4_ = local_3c0._0_4_ * auVar229._0_4_;
        auVar39._8_4_ = local_3c0._8_4_ * auVar229._8_4_;
        auVar39._12_4_ = local_3c0._12_4_ * auVar229._12_4_;
        auVar39._16_4_ = local_3c0._16_4_ * auVar229._16_4_;
        auVar39._20_4_ = local_3c0._20_4_ * auVar229._20_4_;
        auVar39._24_4_ = local_3c0._24_4_ * auVar229._24_4_;
        auVar39._28_4_ = auVar73._28_4_;
        auVar65 = vfmadd213ps_fma(auVar82,local_3a0,auVar39);
        auVar65 = vfmadd213ps_fma(auVar80,_local_380,ZEXT1632(auVar65));
        auVar73 = vandps_avx(ZEXT1632(auVar65),auVar224);
        uVar11 = vcmpps_avx512vl(auVar73,auVar214,1);
        local_990 = (undefined4)CONCAT71((int7)(uVar58 >> 8),~(byte)uVar58);
        bVar47 = (byte)uVar11 | ~(byte)uVar58;
        auVar131._8_4_ = 2;
        auVar131._0_8_ = 0x200000002;
        auVar131._12_4_ = 2;
        auVar131._16_4_ = 2;
        auVar131._20_4_ = 2;
        auVar131._24_4_ = 2;
        auVar131._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar73 = vpblendmd_avx512vl(auVar131,auVar27);
        local_280._0_4_ = (uint)(bVar47 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar47 & 1) * 2;
        bVar56 = (bool)(bVar47 >> 1 & 1);
        local_280._4_4_ = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar47 >> 2 & 1);
        local_280._8_4_ = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar47 >> 3 & 1);
        local_280._12_4_ = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar47 >> 4 & 1);
        local_280._16_4_ = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar47 >> 5 & 1);
        local_280._20_4_ = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar47 >> 6 & 1);
        local_280._24_4_ = (uint)bVar56 * auVar73._24_4_ | (uint)!bVar56 * 2;
        local_280._28_4_ = (uint)(bVar47 >> 7) * auVar73._28_4_ | (uint)!(bool)(bVar47 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar11 = vpcmpd_avx512vl(local_300,local_280,5);
        local_98c = (uint)bVar48;
        bVar48 = (byte)uVar11 & bVar48;
        auVar228 = ZEXT3264(local_820);
        if (bVar48 == 0) {
          auVar133._4_4_ = uVar60;
          auVar133._0_4_ = uVar60;
          auVar133._8_4_ = uVar60;
          auVar133._12_4_ = uVar60;
          auVar133._16_4_ = uVar60;
          auVar133._20_4_ = uVar60;
          auVar133._24_4_ = uVar60;
          auVar133._28_4_ = uVar60;
          auVar233 = ZEXT3264(local_840);
          auVar225 = ZEXT3264(local_860);
          auVar73 = local_2e0;
        }
        else {
          local_2a0 = local_2e0;
          auVar63 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar65 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar69 = vminps_avx(auVar63,auVar68);
          auVar63 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar68 = vmaxps_avx(auVar65,auVar63);
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar69,auVar168);
          auVar63 = vandps_avx(auVar68,auVar168);
          auVar65 = vmaxps_avx(auVar65,auVar63);
          auVar63 = vmovshdup_avx(auVar65);
          auVar63 = vmaxss_avx(auVar63,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar63);
          fVar137 = auVar65._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar68,auVar68,0xff);
          local_340 = (float)local_800._0_4_ + (float)local_980._0_4_;
          fStack_33c = (float)local_800._4_4_ + (float)local_980._4_4_;
          fStack_338 = fStack_7f8 + fStack_978;
          fStack_334 = fStack_7f4 + fStack_974;
          fStack_330 = fStack_7f0 + fStack_970;
          fStack_32c = fStack_7ec + fStack_96c;
          fStack_328 = fStack_7e8 + fStack_968;
          fStack_324 = fStack_7e4 + fStack_964;
          do {
            auVar132._8_4_ = 0x7f800000;
            auVar132._0_8_ = 0x7f8000007f800000;
            auVar132._12_4_ = 0x7f800000;
            auVar132._16_4_ = 0x7f800000;
            auVar132._20_4_ = 0x7f800000;
            auVar132._24_4_ = 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar73 = vblendmps_avx512vl(auVar132,_local_800);
            auVar107._0_4_ =
                 (uint)(bVar48 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar48 & 1) * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 1 & 1);
            auVar107._4_4_ = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 2 & 1);
            auVar107._8_4_ = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 3 & 1);
            auVar107._12_4_ = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 4 & 1);
            auVar107._16_4_ = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 5 & 1);
            auVar107._20_4_ = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * 0x7f800000;
            auVar107._24_4_ =
                 (uint)(bVar48 >> 6) * auVar73._24_4_ | (uint)!(bool)(bVar48 >> 6) * 0x7f800000;
            auVar107._28_4_ = 0x7f800000;
            auVar73 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar73 = vminps_avx(auVar107,auVar73);
            auVar75 = vshufpd_avx(auVar73,auVar73,5);
            auVar73 = vminps_avx(auVar73,auVar75);
            auVar75 = vpermpd_avx2(auVar73,0x4e);
            auVar73 = vminps_avx(auVar73,auVar75);
            uVar11 = vcmpps_avx512vl(auVar107,auVar73,0);
            bVar46 = (byte)uVar11 & bVar48;
            bVar47 = bVar48;
            if (bVar46 != 0) {
              bVar47 = bVar46;
            }
            iVar14 = 0;
            for (uVar60 = (uint)bVar47; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            auVar206 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar14 << 2)));
            fVar157 = local_988;
            fVar155 = *(float *)(local_1c0 + (uint)(iVar14 << 2));
            uVar138 = 0;
            uVar230 = 0;
            uVar231 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar14 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar14 << 2)));
              fVar157 = sqrtf((float)local_6a0._0_4_);
              auVar206 = ZEXT1664(local_760._0_16_);
              fVar155 = (float)local_780._0_4_;
              uVar138 = local_780._4_4_;
              uVar230 = local_780._8_4_;
              uVar231 = local_780._12_4_;
            }
            bVar56 = true;
            uVar58 = 0;
            do {
              auVar73 = local_780;
              auVar122._4_4_ = fVar155;
              auVar122._0_4_ = fVar155;
              auVar122._8_4_ = fVar155;
              auVar122._12_4_ = fVar155;
              auVar63 = vfmadd132ps_fma(auVar122,ZEXT816(0) << 0x40,local_690);
              fVar154 = auVar206._0_4_;
              fVar136 = 1.0 - fVar154;
              auVar169._0_4_ = local_5a0._0_4_ * fVar154;
              auVar169._4_4_ = local_5a0._4_4_ * fVar154;
              auVar169._8_4_ = local_5a0._8_4_ * fVar154;
              auVar169._12_4_ = local_5a0._12_4_ * fVar154;
              local_4e0._0_16_ = ZEXT416((uint)fVar136);
              auVar193._4_4_ = fVar136;
              auVar193._0_4_ = fVar136;
              auVar193._8_4_ = fVar136;
              auVar193._12_4_ = fVar136;
              auVar65 = vfmadd231ps_fma(auVar169,auVar193,local_560._0_16_);
              auVar198._0_4_ = local_580._0_4_ * fVar154;
              auVar198._4_4_ = local_580._4_4_ * fVar154;
              auVar198._8_4_ = local_580._8_4_ * fVar154;
              auVar198._12_4_ = local_580._12_4_ * fVar154;
              auVar68 = vfmadd231ps_fma(auVar198,auVar193,local_5a0._0_16_);
              auVar210._0_4_ = fVar154 * (float)local_5c0._0_4_;
              auVar210._4_4_ = fVar154 * (float)local_5c0._4_4_;
              auVar210._8_4_ = fVar154 * fStack_5b8;
              auVar210._12_4_ = fVar154 * fStack_5b4;
              auVar69 = vfmadd231ps_fma(auVar210,auVar193,local_580._0_16_);
              auVar220._0_4_ = fVar154 * auVar68._0_4_;
              auVar220._4_4_ = fVar154 * auVar68._4_4_;
              auVar220._8_4_ = fVar154 * auVar68._8_4_;
              auVar220._12_4_ = fVar154 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar220,auVar193,auVar65);
              auVar170._0_4_ = fVar154 * auVar69._0_4_;
              auVar170._4_4_ = fVar154 * auVar69._4_4_;
              auVar170._8_4_ = fVar154 * auVar69._8_4_;
              auVar170._12_4_ = fVar154 * auVar69._12_4_;
              auVar68 = vfmadd231ps_fma(auVar170,auVar193,auVar68);
              auVar199._0_4_ = fVar154 * auVar68._0_4_;
              auVar199._4_4_ = fVar154 * auVar68._4_4_;
              auVar199._8_4_ = fVar154 * auVar68._8_4_;
              auVar199._12_4_ = fVar154 * auVar68._12_4_;
              auVar69 = vfmadd231ps_fma(auVar199,auVar65,auVar193);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar16._8_4_ = 0x40400000;
              auVar16._0_8_ = 0x4040000040400000;
              auVar16._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar65,auVar16);
              _local_4c0 = auVar69;
              auVar65 = vsubps_avx(auVar63,auVar69);
              local_6c0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_660._0_16_ = auVar65;
              local_760._0_16_ = auVar206._0_16_;
              local_780._4_4_ = uVar138;
              local_780._0_4_ = fVar155;
              local_780._8_4_ = uVar230;
              local_780._16_16_ = auVar73._16_16_;
              local_780._12_4_ = uVar231;
              if (auVar65._0_4_ < 0.0) {
                auVar228._0_4_ = sqrtf(auVar65._0_4_);
                auVar228._4_60_ = extraout_var;
                auVar65 = auVar228._0_16_;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
              }
              local_500._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar136 = local_500._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar136;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              fVar154 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_500._0_16_,auVar17);
              auVar63 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar63._0_4_;
              local_680._0_4_ = auVar65._0_4_;
              if (fVar136 < auVar69._0_4_) {
                auVar233._0_4_ = sqrtf(fVar136);
                auVar233._4_60_ = extraout_var_00;
                auVar65 = ZEXT416((uint)local_680._0_4_);
                auVar63 = auVar233._0_16_;
              }
              else {
                auVar63 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar156 = local_6e0._0_4_;
              fVar136 = fVar154 * 1.5 + fVar136 * -0.5 * fVar156 * fVar156 * fVar156;
              auVar123._0_4_ = auVar68._0_4_ * fVar136;
              auVar123._4_4_ = auVar68._4_4_ * fVar136;
              auVar123._8_4_ = auVar68._8_4_ * fVar136;
              auVar123._12_4_ = auVar68._12_4_ * fVar136;
              local_6e0._0_16_ = vdpps_avx(local_6c0._0_16_,auVar123,0x7f);
              auVar70 = vaddss_avx512f(auVar65,ZEXT416(0x3f800000));
              auVar124._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar124._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar124._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar124._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar69 = vsubps_avx(local_660._0_16_,auVar124);
              fVar154 = auVar69._0_4_;
              auVar142._4_12_ = ZEXT812(0) << 0x20;
              auVar142._0_4_ = fVar154;
              auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar142);
              auVar71 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
              auVar67 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              uVar57 = fVar154 == 0.0;
              uVar55 = fVar154 < 0.0;
              if ((bool)uVar55) {
                local_600._0_4_ = auVar71._0_4_;
                local_620 = fVar136;
                fStack_61c = fVar136;
                fStack_618 = fVar136;
                fStack_614 = fVar136;
                local_610 = auVar66;
                fVar159 = sqrtf(fVar154);
                auVar67 = ZEXT416(auVar67._0_4_);
                auVar71 = ZEXT416((uint)local_600._0_4_);
                auVar63 = ZEXT416(auVar63._0_4_);
                auVar65 = ZEXT416((uint)local_680._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar66 = local_610;
                fVar136 = local_620;
                fVar154 = fStack_61c;
                fVar156 = fStack_618;
                fVar158 = fStack_614;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar159 = auVar69._0_4_;
                fVar154 = fVar136;
                fVar156 = fVar136;
                fVar158 = fVar136;
              }
              auVar250 = ZEXT3264(local_700);
              auVar228 = ZEXT3264(local_820);
              auVar233 = ZEXT3264(local_840);
              auVar249 = ZEXT3264(local_880);
              auVar238 = ZEXT3264(local_8a0);
              auVar239 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_8e0);
              auVar241 = ZEXT3264(local_900);
              auVar242 = ZEXT3264(local_7a0);
              auVar243 = ZEXT3264(local_920);
              auVar244 = ZEXT3264(local_7c0);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_960);
              auVar247 = ZEXT3264(local_7e0);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar135 = auVar69._0_4_ * 6.0;
              fVar160 = local_760._0_4_ * 6.0;
              auVar172._0_4_ = fVar160 * (float)local_5c0._0_4_;
              auVar172._4_4_ = fVar160 * (float)local_5c0._4_4_;
              auVar172._8_4_ = fVar160 * fStack_5b8;
              auVar172._12_4_ = fVar160 * fStack_5b4;
              auVar143._4_4_ = fVar135;
              auVar143._0_4_ = fVar135;
              auVar143._8_4_ = fVar135;
              auVar143._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar143,auVar172,local_580._0_16_);
              auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar135 = auVar248._0_4_ * 6.0;
              auVar173._4_4_ = fVar135;
              auVar173._0_4_ = fVar135;
              auVar173._8_4_ = fVar135;
              auVar173._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar173,auVar69,local_5a0._0_16_);
              fVar135 = local_4e0._0_4_ * 6.0;
              auVar144._4_4_ = fVar135;
              auVar144._0_4_ = fVar135;
              auVar144._8_4_ = fVar135;
              auVar144._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar144,auVar69,local_560._0_16_);
              auVar174._0_4_ = auVar69._0_4_ * (float)local_500._0_4_;
              auVar174._4_4_ = auVar69._4_4_ * (float)local_500._0_4_;
              auVar174._8_4_ = auVar69._8_4_ * (float)local_500._0_4_;
              auVar174._12_4_ = auVar69._12_4_ * (float)local_500._0_4_;
              auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
              fVar135 = auVar69._0_4_;
              auVar145._0_4_ = auVar68._0_4_ * fVar135;
              auVar145._4_4_ = auVar68._4_4_ * fVar135;
              auVar145._8_4_ = auVar68._8_4_ * fVar135;
              auVar145._12_4_ = auVar68._12_4_ * fVar135;
              auVar69 = vsubps_avx(auVar174,auVar145);
              fVar135 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar68,auVar18);
              auVar200._0_4_ = fVar136 * auVar69._0_4_ * fVar135;
              auVar200._4_4_ = fVar154 * auVar69._4_4_ * fVar135;
              auVar200._8_4_ = fVar156 * auVar69._8_4_ * fVar135;
              auVar200._12_4_ = fVar158 * auVar69._12_4_ * fVar135;
              auVar69 = vdpps_avx(auVar72,auVar123,0x7f);
              auVar248 = vmaxss_avx(ZEXT416((uint)fVar137),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar157 * 1.9073486e-06)
                                           ));
              auVar64 = vdivss_avx512f(ZEXT416((uint)fVar137),auVar63);
              auVar63 = vdpps_avx(local_6c0._0_16_,auVar200,0x7f);
              auVar65 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar137),auVar248);
              vfmadd213ss_avx512f(auVar70,auVar64,auVar65);
              auVar65 = vdpps_avx(local_690,auVar123,0x7f);
              fVar136 = auVar69._0_4_ + auVar63._0_4_;
              auVar63 = vdpps_avx(local_6c0._0_16_,auVar72,0x7f);
              auVar70 = vmulss_avx512f(auVar67,auVar66);
              auVar66 = vmulss_avx512f(auVar66,auVar66);
              auVar69 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              auVar66 = vaddss_avx512f(auVar71,ZEXT416((uint)(auVar70._0_4_ * auVar66._0_4_)));
              auVar70 = vfnmadd231ss_avx512f(auVar63,local_6e0._0_16_,ZEXT416((uint)fVar136));
              auVar71 = vfnmadd231ss_avx512f(auVar69,local_6e0._0_16_,auVar65);
              auVar63 = vpermilps_avx(_local_4c0,0xff);
              fVar159 = fVar159 - auVar63._0_4_;
              auVar63 = vshufps_avx(auVar68,auVar68,0xff);
              auVar69 = vfmsub213ss_fma(auVar70,auVar66,auVar63);
              fVar154 = auVar71._0_4_ * auVar66._0_4_;
              auVar66 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar136),ZEXT416((uint)fVar154));
              fVar156 = auVar66._0_4_;
              auVar221._0_4_ = fVar154 / fVar156;
              auVar221._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar69._0_4_ / fVar156;
              auVar211._4_12_ = auVar69._4_12_;
              auVar69 = vmulss_avx512f(local_6e0._0_16_,auVar221);
              auVar66 = vmulss_avx512f(local_6e0._0_16_,auVar211);
              fVar161 = local_760._0_4_ - (auVar69._0_4_ - fVar159 * (auVar65._0_4_ / fVar156));
              auVar206 = ZEXT464((uint)fVar161);
              fVar155 = (float)local_780._0_4_ - (fVar159 * (fVar136 / fVar156) - auVar66._0_4_);
              uVar138 = 0;
              uVar230 = 0;
              uVar231 = 0;
              auVar19._8_4_ = 0x7fffffff;
              auVar19._0_8_ = 0x7fffffff7fffffff;
              auVar19._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(local_6e0._0_16_,auVar19);
              auVar65 = vucomiss_avx512f(auVar65);
              fVar136 = (float)local_980._0_4_;
              fVar154 = (float)local_980._4_4_;
              fVar156 = fStack_978;
              fVar158 = fStack_974;
              fVar135 = fStack_970;
              fVar160 = fStack_96c;
              fVar162 = fStack_968;
              fVar164 = fStack_964;
              if (!(bool)uVar55 && !(bool)uVar57) {
                auVar65 = vaddss_avx512f(auVar248,auVar65);
                auVar65 = vfmadd231ss_fma(auVar65,local_630,ZEXT416(0x36000000));
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar159),auVar20);
                if (auVar69._0_4_ < auVar65._0_4_) {
                  fVar155 = fVar155 + (float)local_640._0_4_;
                  auVar225 = ZEXT3264(local_860);
                  if (fVar118 <= fVar155) {
                    fVar157 = *(float *)(ray + k * 4 + 0x80);
                    bVar47 = 0;
                    if (((fVar157 < fVar155) || (fVar161 < 0.0)) || (bVar47 = 0, 1.0 < fVar161))
                    goto LAB_01af615e;
                    auVar175._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar175._0_4_ = local_660._0_4_;
                    auVar65 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar175);
                    fVar159 = auVar65._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar54].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar47 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01af615e;
                      fVar159 = fVar159 * 1.5 +
                                (float)local_660._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                      auVar176._0_4_ = local_6c0._0_4_ * fVar159;
                      auVar176._4_4_ = local_6c0._4_4_ * fVar159;
                      auVar176._8_4_ = local_6c0._8_4_ * fVar159;
                      auVar176._12_4_ = local_6c0._12_4_ * fVar159;
                      auVar69 = vfmadd213ps_fma(auVar63,auVar176,auVar68);
                      auVar65 = vshufps_avx(auVar176,auVar176,0xc9);
                      auVar63 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar177._0_4_ = auVar176._0_4_ * auVar63._0_4_;
                      auVar177._4_4_ = auVar176._4_4_ * auVar63._4_4_;
                      auVar177._8_4_ = auVar176._8_4_ * auVar63._8_4_;
                      auVar177._12_4_ = auVar176._12_4_ * auVar63._12_4_;
                      auVar68 = vfmsub231ps_fma(auVar177,auVar68,auVar65);
                      auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar63 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                      auVar125._0_4_ = auVar69._0_4_ * auVar68._0_4_;
                      auVar125._4_4_ = auVar69._4_4_ * auVar68._4_4_;
                      auVar125._8_4_ = auVar69._8_4_ * auVar68._8_4_;
                      auVar125._12_4_ = auVar69._12_4_ * auVar68._12_4_;
                      auVar65 = vfmsub231ps_fma(auVar125,auVar65,auVar63);
                      local_460 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                      auStack_450 = vshufps_avx(auVar65,auVar65,0xaa);
                      local_440 = auVar65._0_4_;
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      local_430 = fVar161;
                      fStack_42c = fVar161;
                      fStack_428 = fVar161;
                      fStack_424 = fVar161;
                      local_420 = ZEXT416(0) << 0x20;
                      local_410 = local_470._0_8_;
                      uStack_408 = local_470._8_8_;
                      local_400 = local_480;
                      vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                      uStack_3ec = context->user->instID[0];
                      local_3f0 = uStack_3ec;
                      uStack_3e8 = uStack_3ec;
                      uStack_3e4 = uStack_3ec;
                      uStack_3e0 = context->user->instPrimID[0];
                      uStack_3dc = uStack_3e0;
                      uStack_3d8 = uStack_3e0;
                      uStack_3d4 = uStack_3e0;
                      *(float *)(ray + k * 4 + 0x80) = fVar155;
                      local_9a0 = local_490;
                      local_730.valid = (int *)local_9a0;
                      local_730.geometryUserPtr = pGVar2->userPtr;
                      local_730.context = context->user;
                      local_730.hit = local_460;
                      local_730.N = 4;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar2->occlusionFilterN)(&local_730);
                        auVar247 = ZEXT3264(local_7e0);
                        auVar246 = ZEXT3264(local_960);
                        auVar245 = ZEXT3264(local_940);
                        auVar244 = ZEXT3264(local_7c0);
                        auVar243 = ZEXT3264(local_920);
                        auVar242 = ZEXT3264(local_7a0);
                        auVar241 = ZEXT3264(local_900);
                        auVar240 = ZEXT3264(local_8e0);
                        auVar239 = ZEXT3264(local_8c0);
                        auVar238 = ZEXT3264(local_8a0);
                        auVar225 = ZEXT3264(local_860);
                        auVar249 = ZEXT3264(local_880);
                        auVar233 = ZEXT3264(local_840);
                        auVar228 = ZEXT3264(local_820);
                        auVar250 = ZEXT3264(local_700);
                        fVar136 = (float)local_980._0_4_;
                        fVar154 = (float)local_980._4_4_;
                        fVar156 = fStack_978;
                        fVar158 = fStack_974;
                        fVar135 = fStack_970;
                        fVar160 = fStack_96c;
                        fVar162 = fStack_968;
                        fVar164 = fStack_964;
                      }
                      uVar58 = vptestmd_avx512vl(local_9a0,local_9a0);
                      if ((uVar58 & 0xf) != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var3)(&local_730);
                          auVar247 = ZEXT3264(local_7e0);
                          auVar246 = ZEXT3264(local_960);
                          auVar245 = ZEXT3264(local_940);
                          auVar244 = ZEXT3264(local_7c0);
                          auVar243 = ZEXT3264(local_920);
                          auVar242 = ZEXT3264(local_7a0);
                          auVar241 = ZEXT3264(local_900);
                          auVar240 = ZEXT3264(local_8e0);
                          auVar239 = ZEXT3264(local_8c0);
                          auVar238 = ZEXT3264(local_8a0);
                          auVar225 = ZEXT3264(local_860);
                          auVar249 = ZEXT3264(local_880);
                          auVar233 = ZEXT3264(local_840);
                          auVar228 = ZEXT3264(local_820);
                          auVar250 = ZEXT3264(local_700);
                          fVar136 = (float)local_980._0_4_;
                          fVar154 = (float)local_980._4_4_;
                          fVar156 = fStack_978;
                          fVar158 = fStack_974;
                          fVar135 = fStack_970;
                          fVar160 = fStack_96c;
                          fVar162 = fStack_968;
                          fVar164 = fStack_964;
                        }
                        uVar58 = vptestmd_avx512vl(local_9a0,local_9a0);
                        uVar58 = uVar58 & 0xf;
                        auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar58 & 1);
                        bVar5 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar7 = SUB81(uVar58 >> 3,0);
                        *(uint *)(local_730.ray + 0x80) =
                             (uint)bVar4 * auVar65._0_4_ |
                             (uint)!bVar4 * *(int *)(local_730.ray + 0x80);
                        *(uint *)(local_730.ray + 0x84) =
                             (uint)bVar5 * auVar65._4_4_ |
                             (uint)!bVar5 * *(int *)(local_730.ray + 0x84);
                        *(uint *)(local_730.ray + 0x88) =
                             (uint)bVar6 * auVar65._8_4_ |
                             (uint)!bVar6 * *(int *)(local_730.ray + 0x88);
                        *(uint *)(local_730.ray + 0x8c) =
                             (uint)bVar7 * auVar65._12_4_ |
                             (uint)!bVar7 * *(int *)(local_730.ray + 0x8c);
                        bVar47 = 1;
                        if ((byte)uVar58 != 0) goto LAB_01af615e;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar157;
                      bVar47 = 0;
                      goto LAB_01af615e;
                    }
                  }
                  bVar47 = 0;
                  goto LAB_01af615e;
                }
              }
              bVar56 = uVar58 < 4;
              uVar58 = uVar58 + 1;
            } while (uVar58 != 5);
            bVar56 = false;
            auVar225 = ZEXT3264(local_860);
            bVar47 = 5;
LAB_01af615e:
            bVar53 = (bool)(bVar53 | bVar56 & bVar47);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar133._4_4_ = uVar138;
            auVar133._0_4_ = uVar138;
            auVar133._8_4_ = uVar138;
            auVar133._12_4_ = uVar138;
            auVar133._16_4_ = uVar138;
            auVar133._20_4_ = uVar138;
            auVar133._24_4_ = uVar138;
            auVar133._28_4_ = uVar138;
            auVar42._4_4_ = fStack_33c;
            auVar42._0_4_ = local_340;
            auVar42._8_4_ = fStack_338;
            auVar42._12_4_ = fStack_334;
            auVar42._16_4_ = fStack_330;
            auVar42._20_4_ = fStack_32c;
            auVar42._24_4_ = fStack_328;
            auVar42._28_4_ = fStack_324;
            uVar11 = vcmpps_avx512vl(auVar133,auVar42,0xd);
            bVar48 = ~('\x01' << ((byte)iVar14 & 0x1f)) & bVar48 & (byte)uVar11;
            auVar73 = local_2a0;
          } while (bVar48 != 0);
        }
        bVar48 = local_360[0] | (byte)local_990;
        auVar152._0_4_ = fVar136 + auVar73._0_4_;
        auVar152._4_4_ = fVar154 + auVar73._4_4_;
        auVar152._8_4_ = fVar156 + auVar73._8_4_;
        auVar152._12_4_ = fVar158 + auVar73._12_4_;
        auVar152._16_4_ = fVar135 + auVar73._16_4_;
        auVar152._20_4_ = fVar160 + auVar73._20_4_;
        auVar152._24_4_ = fVar162 + auVar73._24_4_;
        auVar152._28_4_ = fVar164 + auVar73._28_4_;
        uVar11 = vcmpps_avx512vl(auVar152,auVar133,2);
        bVar45 = (byte)uVar12 & bVar45 & (byte)uVar11;
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar73 = vpblendmd_avx512vl(auVar153,auVar28);
        auVar108._0_4_ = (uint)(bVar48 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar48 & 1) * 2;
        bVar56 = (bool)(bVar48 >> 1 & 1);
        auVar108._4_4_ = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar48 >> 2 & 1);
        auVar108._8_4_ = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar48 >> 3 & 1);
        auVar108._12_4_ = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar48 >> 4 & 1);
        auVar108._16_4_ = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar48 >> 5 & 1);
        auVar108._20_4_ = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar48 >> 6 & 1);
        auVar108._24_4_ = (uint)bVar56 * auVar73._24_4_ | (uint)!bVar56 * 2;
        auVar108._28_4_ = (uint)(bVar48 >> 7) * auVar73._28_4_ | (uint)!(bool)(bVar48 >> 7) * 2;
        uVar11 = vpcmpd_avx512vl(local_300,auVar108,5);
        bVar48 = (byte)uVar11 & bVar45;
        if (bVar48 != 0) {
          local_360 = auVar108;
          auVar63 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar65 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar69 = vminps_avx(auVar63,auVar68);
          auVar63 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar206 = ZEXT3264(local_2e0);
          auVar68 = vmaxps_avx(auVar65,auVar63);
          auVar178._8_4_ = 0x7fffffff;
          auVar178._0_8_ = 0x7fffffff7fffffff;
          auVar178._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar69,auVar178);
          auVar63 = vandps_avx(auVar68,auVar178);
          auVar65 = vmaxps_avx(auVar65,auVar63);
          auVar63 = vmovshdup_avx(auVar65);
          auVar63 = vmaxss_avx(auVar63,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar63);
          fVar137 = auVar65._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar68,auVar68,0xff);
          local_340 = fVar136 + local_2e0._0_4_;
          fStack_33c = fVar154 + local_2e0._4_4_;
          fStack_338 = fVar156 + local_2e0._8_4_;
          fStack_334 = fVar158 + local_2e0._12_4_;
          fStack_330 = fVar135 + local_2e0._16_4_;
          fStack_32c = fVar160 + local_2e0._20_4_;
          fStack_328 = fVar162 + local_2e0._24_4_;
          fStack_324 = fVar164 + local_2e0._28_4_;
          _local_800 = local_2e0;
          do {
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar73 = vblendmps_avx512vl(auVar134,auVar206._0_32_);
            auVar109._0_4_ =
                 (uint)(bVar48 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar48 & 1) * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 1 & 1);
            auVar109._4_4_ = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 2 & 1);
            auVar109._8_4_ = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 3 & 1);
            auVar109._12_4_ = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 4 & 1);
            auVar109._16_4_ = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar48 >> 5 & 1);
            auVar109._20_4_ = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * 0x7f800000;
            auVar109._24_4_ =
                 (uint)(bVar48 >> 6) * auVar73._24_4_ | (uint)!(bool)(bVar48 >> 6) * 0x7f800000;
            auVar109._28_4_ = 0x7f800000;
            auVar73 = vshufps_avx(auVar109,auVar109,0xb1);
            auVar73 = vminps_avx(auVar109,auVar73);
            auVar75 = vshufpd_avx(auVar73,auVar73,5);
            auVar73 = vminps_avx(auVar73,auVar75);
            auVar75 = vpermpd_avx2(auVar73,0x4e);
            auVar73 = vminps_avx(auVar73,auVar75);
            uVar11 = vcmpps_avx512vl(auVar109,auVar73,0);
            bVar46 = (byte)uVar11 & bVar48;
            bVar47 = bVar48;
            if (bVar46 != 0) {
              bVar47 = bVar46;
            }
            iVar14 = 0;
            for (uVar60 = (uint)bVar47; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            auVar206 = ZEXT464(*(uint *)(local_200 + (uint)(iVar14 << 2)));
            fVar157 = local_984;
            fVar155 = *(float *)(local_2c0 + (uint)(iVar14 << 2));
            uVar138 = 0;
            uVar230 = 0;
            uVar231 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar14 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_2c0 + (uint)(iVar14 << 2)));
              fVar157 = sqrtf((float)local_6a0._0_4_);
              auVar206 = ZEXT1664(local_760._0_16_);
              fVar155 = (float)local_780._0_4_;
              uVar138 = local_780._4_4_;
              uVar230 = local_780._8_4_;
              uVar231 = local_780._12_4_;
            }
            bVar56 = true;
            uVar58 = 0;
            do {
              auVar73 = local_780;
              auVar126._4_4_ = fVar155;
              auVar126._0_4_ = fVar155;
              auVar126._8_4_ = fVar155;
              auVar126._12_4_ = fVar155;
              auVar63 = vfmadd132ps_fma(auVar126,ZEXT816(0) << 0x40,local_690);
              fVar154 = auVar206._0_4_;
              fVar136 = 1.0 - fVar154;
              auVar179._0_4_ = local_5a0._0_4_ * fVar154;
              auVar179._4_4_ = local_5a0._4_4_ * fVar154;
              auVar179._8_4_ = local_5a0._8_4_ * fVar154;
              auVar179._12_4_ = local_5a0._12_4_ * fVar154;
              local_4e0._0_16_ = ZEXT416((uint)fVar136);
              auVar194._4_4_ = fVar136;
              auVar194._0_4_ = fVar136;
              auVar194._8_4_ = fVar136;
              auVar194._12_4_ = fVar136;
              auVar65 = vfmadd231ps_fma(auVar179,auVar194,local_560._0_16_);
              auVar201._0_4_ = local_580._0_4_ * fVar154;
              auVar201._4_4_ = local_580._4_4_ * fVar154;
              auVar201._8_4_ = local_580._8_4_ * fVar154;
              auVar201._12_4_ = local_580._12_4_ * fVar154;
              auVar68 = vfmadd231ps_fma(auVar201,auVar194,local_5a0._0_16_);
              auVar212._0_4_ = fVar154 * (float)local_5c0._0_4_;
              auVar212._4_4_ = fVar154 * (float)local_5c0._4_4_;
              auVar212._8_4_ = fVar154 * fStack_5b8;
              auVar212._12_4_ = fVar154 * fStack_5b4;
              auVar69 = vfmadd231ps_fma(auVar212,auVar194,local_580._0_16_);
              auVar222._0_4_ = fVar154 * auVar68._0_4_;
              auVar222._4_4_ = fVar154 * auVar68._4_4_;
              auVar222._8_4_ = fVar154 * auVar68._8_4_;
              auVar222._12_4_ = fVar154 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar222,auVar194,auVar65);
              auVar180._0_4_ = fVar154 * auVar69._0_4_;
              auVar180._4_4_ = fVar154 * auVar69._4_4_;
              auVar180._8_4_ = fVar154 * auVar69._8_4_;
              auVar180._12_4_ = fVar154 * auVar69._12_4_;
              auVar68 = vfmadd231ps_fma(auVar180,auVar194,auVar68);
              auVar202._0_4_ = fVar154 * auVar68._0_4_;
              auVar202._4_4_ = fVar154 * auVar68._4_4_;
              auVar202._8_4_ = fVar154 * auVar68._8_4_;
              auVar202._12_4_ = fVar154 * auVar68._12_4_;
              auVar69 = vfmadd231ps_fma(auVar202,auVar65,auVar194);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar65,auVar21);
              _local_4c0 = auVar69;
              auVar65 = vsubps_avx(auVar63,auVar69);
              local_6c0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_660._0_16_ = auVar65;
              local_760._0_16_ = auVar206._0_16_;
              local_780._4_4_ = uVar138;
              local_780._0_4_ = fVar155;
              local_780._8_4_ = uVar230;
              local_780._16_16_ = auVar73._16_16_;
              local_780._12_4_ = uVar231;
              if (auVar65._0_4_ < 0.0) {
                auVar238._0_4_ = sqrtf(auVar65._0_4_);
                auVar238._4_60_ = extraout_var_01;
                auVar65 = auVar238._0_16_;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
              }
              local_500._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar136 = local_500._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar136;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              fVar154 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_500._0_16_,auVar22);
              auVar63 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar63._0_4_;
              local_680._0_4_ = auVar65._0_4_;
              if (fVar136 < auVar69._0_4_) {
                auVar239._0_4_ = sqrtf(fVar136);
                auVar239._4_60_ = extraout_var_02;
                auVar65 = ZEXT416((uint)local_680._0_4_);
                auVar63 = auVar239._0_16_;
              }
              else {
                auVar63 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar156 = local_6e0._0_4_;
              fVar136 = fVar154 * 1.5 + fVar136 * -0.5 * fVar156 * fVar156 * fVar156;
              auVar236._0_4_ = auVar68._0_4_ * fVar136;
              auVar236._4_4_ = auVar68._4_4_ * fVar136;
              auVar236._8_4_ = auVar68._8_4_ * fVar136;
              auVar236._12_4_ = auVar68._12_4_ * fVar136;
              local_6e0._0_16_ = vdpps_avx(local_6c0._0_16_,auVar236,0x7f);
              auVar70 = vaddss_avx512f(auVar65,ZEXT416(0x3f800000));
              auVar127._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar127._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar127._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar127._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar69 = vsubps_avx(local_660._0_16_,auVar127);
              fVar154 = auVar69._0_4_;
              auVar146._4_12_ = ZEXT812(0) << 0x20;
              auVar146._0_4_ = fVar154;
              auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
              auVar71 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
              auVar67 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              uVar57 = fVar154 == 0.0;
              uVar55 = fVar154 < 0.0;
              if ((bool)uVar55) {
                local_620 = fVar136;
                fStack_61c = fVar136;
                fStack_618 = fVar136;
                fStack_614 = fVar136;
                local_610 = auVar236;
                local_600 = auVar66;
                fVar159 = sqrtf(fVar154);
                auVar67 = ZEXT416(auVar67._0_4_);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar63 = ZEXT416(auVar63._0_4_);
                auVar65 = ZEXT416((uint)local_680._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar236 = local_610;
                auVar66 = local_600;
                fVar136 = local_620;
                fVar154 = fStack_61c;
                fVar156 = fStack_618;
                fVar158 = fStack_614;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar159 = auVar69._0_4_;
                fVar154 = fVar136;
                fVar156 = fVar136;
                fVar158 = fVar136;
              }
              auVar250 = ZEXT3264(local_700);
              auVar228 = ZEXT3264(local_820);
              auVar233 = ZEXT3264(local_840);
              auVar249 = ZEXT3264(local_880);
              auVar238 = ZEXT3264(local_8a0);
              auVar239 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_8e0);
              auVar241 = ZEXT3264(local_900);
              auVar242 = ZEXT3264(local_7a0);
              auVar243 = ZEXT3264(local_920);
              auVar244 = ZEXT3264(local_7c0);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_960);
              auVar247 = ZEXT3264(local_7e0);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar135 = auVar69._0_4_ * 6.0;
              fVar160 = local_760._0_4_ * 6.0;
              auVar182._0_4_ = fVar160 * (float)local_5c0._0_4_;
              auVar182._4_4_ = fVar160 * (float)local_5c0._4_4_;
              auVar182._8_4_ = fVar160 * fStack_5b8;
              auVar182._12_4_ = fVar160 * fStack_5b4;
              auVar147._4_4_ = fVar135;
              auVar147._0_4_ = fVar135;
              auVar147._8_4_ = fVar135;
              auVar147._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar147,auVar182,local_580._0_16_);
              auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar135 = auVar248._0_4_ * 6.0;
              auVar183._4_4_ = fVar135;
              auVar183._0_4_ = fVar135;
              auVar183._8_4_ = fVar135;
              auVar183._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar183,auVar69,local_5a0._0_16_);
              fVar135 = local_4e0._0_4_ * 6.0;
              auVar148._4_4_ = fVar135;
              auVar148._0_4_ = fVar135;
              auVar148._8_4_ = fVar135;
              auVar148._12_4_ = fVar135;
              auVar69 = vfmadd132ps_fma(auVar148,auVar69,local_560._0_16_);
              auVar184._0_4_ = auVar69._0_4_ * (float)local_500._0_4_;
              auVar184._4_4_ = auVar69._4_4_ * (float)local_500._0_4_;
              auVar184._8_4_ = auVar69._8_4_ * (float)local_500._0_4_;
              auVar184._12_4_ = auVar69._12_4_ * (float)local_500._0_4_;
              auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
              fVar135 = auVar69._0_4_;
              auVar149._0_4_ = auVar68._0_4_ * fVar135;
              auVar149._4_4_ = auVar68._4_4_ * fVar135;
              auVar149._8_4_ = auVar68._8_4_ * fVar135;
              auVar149._12_4_ = auVar68._12_4_ * fVar135;
              auVar69 = vsubps_avx(auVar184,auVar149);
              fVar135 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar68,auVar23);
              auVar203._0_4_ = fVar136 * auVar69._0_4_ * fVar135;
              auVar203._4_4_ = fVar154 * auVar69._4_4_ * fVar135;
              auVar203._8_4_ = fVar156 * auVar69._8_4_ * fVar135;
              auVar203._12_4_ = fVar158 * auVar69._12_4_ * fVar135;
              auVar69 = vdpps_avx(auVar72,auVar236,0x7f);
              auVar248 = vmaxss_avx(ZEXT416((uint)fVar137),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar157 * 1.9073486e-06)
                                           ));
              auVar64 = vdivss_avx512f(ZEXT416((uint)fVar137),auVar63);
              auVar63 = vdpps_avx(local_6c0._0_16_,auVar203,0x7f);
              auVar65 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar137),auVar248);
              vfmadd213ss_avx512f(auVar70,auVar64,auVar65);
              auVar65 = vdpps_avx(local_690,auVar236,0x7f);
              fVar136 = auVar69._0_4_ + auVar63._0_4_;
              auVar63 = vdpps_avx(local_6c0._0_16_,auVar72,0x7f);
              auVar70 = vmulss_avx512f(auVar67,auVar66);
              auVar66 = vmulss_avx512f(auVar66,auVar66);
              auVar69 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              auVar66 = vaddss_avx512f(auVar71,ZEXT416((uint)(auVar70._0_4_ * auVar66._0_4_)));
              auVar70 = vfnmadd231ss_avx512f(auVar63,local_6e0._0_16_,ZEXT416((uint)fVar136));
              auVar71 = vfnmadd231ss_avx512f(auVar69,local_6e0._0_16_,auVar65);
              auVar63 = vpermilps_avx(_local_4c0,0xff);
              fVar159 = fVar159 - auVar63._0_4_;
              auVar63 = vshufps_avx(auVar68,auVar68,0xff);
              auVar69 = vfmsub213ss_fma(auVar70,auVar66,auVar63);
              fVar154 = auVar71._0_4_ * auVar66._0_4_;
              auVar66 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar136),ZEXT416((uint)fVar154));
              fVar156 = auVar66._0_4_;
              auVar223._0_4_ = fVar154 / fVar156;
              auVar223._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar213._0_4_ = auVar69._0_4_ / fVar156;
              auVar213._4_12_ = auVar69._4_12_;
              auVar69 = vmulss_avx512f(local_6e0._0_16_,auVar223);
              auVar66 = vmulss_avx512f(local_6e0._0_16_,auVar213);
              fVar161 = local_760._0_4_ - (auVar69._0_4_ - fVar159 * (auVar65._0_4_ / fVar156));
              auVar206 = ZEXT464((uint)fVar161);
              fVar155 = (float)local_780._0_4_ - (fVar159 * (fVar136 / fVar156) - auVar66._0_4_);
              uVar138 = 0;
              uVar230 = 0;
              uVar231 = 0;
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(local_6e0._0_16_,auVar24);
              auVar65 = vucomiss_avx512f(auVar65);
              fVar136 = (float)local_980._0_4_;
              fVar154 = (float)local_980._4_4_;
              fVar156 = fStack_978;
              fVar158 = fStack_974;
              fVar135 = fStack_970;
              fVar160 = fStack_96c;
              fVar162 = fStack_968;
              fVar164 = fStack_964;
              if (!(bool)uVar55 && !(bool)uVar57) {
                auVar65 = vaddss_avx512f(auVar248,auVar65);
                auVar65 = vfmadd231ss_fma(auVar65,local_630,ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar159),auVar25);
                if (auVar69._0_4_ < auVar65._0_4_) {
                  fVar155 = fVar155 + (float)local_640._0_4_;
                  auVar225 = ZEXT3264(local_860);
                  if (fVar155 < fVar118) {
LAB_01af6d17:
                    bVar47 = 0;
                    goto LAB_01af6d23;
                  }
                  fVar157 = *(float *)(ray + k * 4 + 0x80);
                  auVar206 = ZEXT3264(_local_800);
                  if (fVar155 <= fVar157) {
                    bVar47 = 0;
                    if ((fVar161 < 0.0) || (1.0 < fVar161)) goto LAB_01af6d2c;
                    auVar41._12_4_ = 0;
                    auVar41._0_12_ = ZEXT812(0);
                    auVar65 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)local_660._0_4_));
                    fVar159 = auVar65._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar54].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01af6d17;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar47 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01af6d23;
                    fVar159 = fVar159 * 1.5 +
                              (float)local_660._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                    auVar185._0_4_ = local_6c0._0_4_ * fVar159;
                    auVar185._4_4_ = local_6c0._4_4_ * fVar159;
                    auVar185._8_4_ = local_6c0._8_4_ * fVar159;
                    auVar185._12_4_ = local_6c0._12_4_ * fVar159;
                    auVar69 = vfmadd213ps_fma(auVar63,auVar185,auVar68);
                    auVar65 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar63 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar186._0_4_ = auVar185._0_4_ * auVar63._0_4_;
                    auVar186._4_4_ = auVar185._4_4_ * auVar63._4_4_;
                    auVar186._8_4_ = auVar185._8_4_ * auVar63._8_4_;
                    auVar186._12_4_ = auVar185._12_4_ * auVar63._12_4_;
                    auVar68 = vfmsub231ps_fma(auVar186,auVar68,auVar65);
                    auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar63 = vshufps_avx(auVar69,auVar69,0xc9);
                    auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                    auVar128._0_4_ = auVar69._0_4_ * auVar68._0_4_;
                    auVar128._4_4_ = auVar69._4_4_ * auVar68._4_4_;
                    auVar128._8_4_ = auVar69._8_4_ * auVar68._8_4_;
                    auVar128._12_4_ = auVar69._12_4_ * auVar68._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar128,auVar65,auVar63);
                    local_460 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                    auStack_450 = vshufps_avx(auVar65,auVar65,0xaa);
                    local_440 = auVar65._0_4_;
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    local_430 = fVar161;
                    fStack_42c = fVar161;
                    fStack_428 = fVar161;
                    fStack_424 = fVar161;
                    local_420 = ZEXT416(0) << 0x20;
                    local_410 = local_470._0_8_;
                    uStack_408 = local_470._8_8_;
                    local_400 = local_480;
                    vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                    uStack_3ec = context->user->instID[0];
                    local_3f0 = uStack_3ec;
                    uStack_3e8 = uStack_3ec;
                    uStack_3e4 = uStack_3ec;
                    uStack_3e0 = context->user->instPrimID[0];
                    uStack_3dc = uStack_3e0;
                    uStack_3d8 = uStack_3e0;
                    uStack_3d4 = uStack_3e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar155;
                    local_9a0 = local_490;
                    local_730.valid = (int *)local_9a0;
                    local_730.geometryUserPtr = pGVar2->userPtr;
                    local_730.context = context->user;
                    local_730.hit = local_460;
                    local_730.N = 4;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar2->occlusionFilterN)(&local_730);
                      auVar247 = ZEXT3264(local_7e0);
                      auVar246 = ZEXT3264(local_960);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_7c0);
                      auVar243 = ZEXT3264(local_920);
                      auVar242 = ZEXT3264(local_7a0);
                      auVar241 = ZEXT3264(local_900);
                      auVar240 = ZEXT3264(local_8e0);
                      auVar239 = ZEXT3264(local_8c0);
                      auVar238 = ZEXT3264(local_8a0);
                      auVar225 = ZEXT3264(local_860);
                      auVar249 = ZEXT3264(local_880);
                      auVar233 = ZEXT3264(local_840);
                      auVar228 = ZEXT3264(local_820);
                      auVar250 = ZEXT3264(local_700);
                      fVar136 = (float)local_980._0_4_;
                      fVar154 = (float)local_980._4_4_;
                      fVar156 = fStack_978;
                      fVar158 = fStack_974;
                      fVar135 = fStack_970;
                      fVar160 = fStack_96c;
                      fVar162 = fStack_968;
                      fVar164 = fStack_964;
                    }
                    uVar58 = vptestmd_avx512vl(local_9a0,local_9a0);
                    if ((uVar58 & 0xf) == 0) {
                      auVar206 = ZEXT3264(_local_800);
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var3)(&local_730);
                        auVar247 = ZEXT3264(local_7e0);
                        auVar246 = ZEXT3264(local_960);
                        auVar245 = ZEXT3264(local_940);
                        auVar244 = ZEXT3264(local_7c0);
                        auVar243 = ZEXT3264(local_920);
                        auVar242 = ZEXT3264(local_7a0);
                        auVar241 = ZEXT3264(local_900);
                        auVar240 = ZEXT3264(local_8e0);
                        auVar239 = ZEXT3264(local_8c0);
                        auVar238 = ZEXT3264(local_8a0);
                        auVar225 = ZEXT3264(local_860);
                        auVar249 = ZEXT3264(local_880);
                        auVar233 = ZEXT3264(local_840);
                        auVar228 = ZEXT3264(local_820);
                        auVar250 = ZEXT3264(local_700);
                        fVar136 = (float)local_980._0_4_;
                        fVar154 = (float)local_980._4_4_;
                        fVar156 = fStack_978;
                        fVar158 = fStack_974;
                        fVar135 = fStack_970;
                        fVar160 = fStack_96c;
                        fVar162 = fStack_968;
                        fVar164 = fStack_964;
                      }
                      uVar58 = vptestmd_avx512vl(local_9a0,local_9a0);
                      uVar58 = uVar58 & 0xf;
                      auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar58 & 1);
                      bVar5 = (bool)((byte)(uVar58 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar58 >> 2) & 1);
                      bVar7 = SUB81(uVar58 >> 3,0);
                      *(uint *)(local_730.ray + 0x80) =
                           (uint)bVar4 * auVar65._0_4_ |
                           (uint)!bVar4 * *(int *)(local_730.ray + 0x80);
                      *(uint *)(local_730.ray + 0x84) =
                           (uint)bVar5 * auVar65._4_4_ |
                           (uint)!bVar5 * *(int *)(local_730.ray + 0x84);
                      *(uint *)(local_730.ray + 0x88) =
                           (uint)bVar6 * auVar65._8_4_ |
                           (uint)!bVar6 * *(int *)(local_730.ray + 0x88);
                      *(uint *)(local_730.ray + 0x8c) =
                           (uint)bVar7 * auVar65._12_4_ |
                           (uint)!bVar7 * *(int *)(local_730.ray + 0x8c);
                      bVar47 = 1;
                      auVar206 = ZEXT3264(_local_800);
                      if ((byte)uVar58 != 0) goto LAB_01af6d2c;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar157;
                  }
                  bVar47 = 0;
                  goto LAB_01af6d2c;
                }
              }
              bVar56 = uVar58 < 4;
              uVar58 = uVar58 + 1;
            } while (uVar58 != 5);
            bVar56 = false;
            bVar47 = 5;
LAB_01af6d23:
            auVar225 = ZEXT3264(local_860);
            auVar206 = ZEXT3264(_local_800);
LAB_01af6d2c:
            bVar53 = (bool)(bVar53 | bVar56 & bVar47);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar133._4_4_ = uVar138;
            auVar133._0_4_ = uVar138;
            auVar133._8_4_ = uVar138;
            auVar133._12_4_ = uVar138;
            auVar133._16_4_ = uVar138;
            auVar133._20_4_ = uVar138;
            auVar133._24_4_ = uVar138;
            auVar133._28_4_ = uVar138;
            auVar43._4_4_ = fStack_33c;
            auVar43._0_4_ = local_340;
            auVar43._8_4_ = fStack_338;
            auVar43._12_4_ = fStack_334;
            auVar43._16_4_ = fStack_330;
            auVar43._20_4_ = fStack_32c;
            auVar43._24_4_ = fStack_328;
            auVar43._28_4_ = fStack_324;
            uVar11 = vcmpps_avx512vl(auVar133,auVar43,0xd);
            bVar48 = ~('\x01' << ((byte)iVar14 & 0x1f)) & bVar48 & (byte)uVar11;
            auVar108 = local_360;
          } while (bVar48 != 0);
        }
        auVar206 = ZEXT3264(local_5e0);
        uVar12 = vpcmpgtd_avx512vl(auVar108,local_300);
        uVar13 = vpcmpd_avx512vl(local_300,local_280,1);
        auVar189._0_4_ = fVar136 + (float)local_1c0._0_4_;
        auVar189._4_4_ = fVar154 + (float)local_1c0._4_4_;
        auVar189._8_4_ = fVar156 + fStack_1b8;
        auVar189._12_4_ = fVar158 + fStack_1b4;
        auVar189._16_4_ = fVar135 + fStack_1b0;
        auVar189._20_4_ = fVar160 + fStack_1ac;
        auVar189._24_4_ = fVar162 + fStack_1a8;
        auVar189._28_4_ = fVar164 + fStack_1a4;
        uVar11 = vcmpps_avx512vl(auVar189,auVar133,2);
        bVar48 = (byte)local_98c & (byte)uVar13 & (byte)uVar11;
        auVar190._0_4_ = fVar136 + local_2e0._0_4_;
        auVar190._4_4_ = fVar154 + local_2e0._4_4_;
        auVar190._8_4_ = fVar156 + local_2e0._8_4_;
        auVar190._12_4_ = fVar158 + local_2e0._12_4_;
        auVar190._16_4_ = fVar135 + local_2e0._16_4_;
        auVar190._20_4_ = fVar160 + local_2e0._20_4_;
        auVar190._24_4_ = fVar162 + local_2e0._24_4_;
        auVar190._28_4_ = fVar164 + local_2e0._28_4_;
        uVar11 = vcmpps_avx512vl(auVar190,auVar133,2);
        bVar45 = bVar45 & (byte)uVar12 & (byte)uVar11 | bVar48;
        prim = local_5f0;
        if (bVar45 != 0) {
          uVar52 = (ulong)uVar51;
          abStack_180[uVar52 * 0x60] = bVar45;
          auVar110._0_4_ =
               (uint)(bVar48 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar48 & 1) * (int)local_2e0._0_4_;
          bVar56 = (bool)(bVar48 >> 1 & 1);
          auVar110._4_4_ = (uint)bVar56 * local_1c0._4_4_ | (uint)!bVar56 * (int)local_2e0._4_4_;
          bVar56 = (bool)(bVar48 >> 2 & 1);
          auVar110._8_4_ = (uint)bVar56 * (int)fStack_1b8 | (uint)!bVar56 * (int)local_2e0._8_4_;
          bVar56 = (bool)(bVar48 >> 3 & 1);
          auVar110._12_4_ = (uint)bVar56 * (int)fStack_1b4 | (uint)!bVar56 * (int)local_2e0._12_4_;
          bVar56 = (bool)(bVar48 >> 4 & 1);
          auVar110._16_4_ = (uint)bVar56 * (int)fStack_1b0 | (uint)!bVar56 * (int)local_2e0._16_4_;
          bVar56 = (bool)(bVar48 >> 5 & 1);
          auVar110._20_4_ = (uint)bVar56 * (int)fStack_1ac | (uint)!bVar56 * (int)local_2e0._20_4_;
          bVar56 = (bool)(bVar48 >> 6 & 1);
          auVar110._24_4_ = (uint)bVar56 * (int)fStack_1a8 | (uint)!bVar56 * (int)local_2e0._24_4_;
          auVar110._28_4_ =
               (uint)(bVar48 >> 7) * (int)fStack_1a4 |
               (uint)!(bool)(bVar48 >> 7) * (int)local_2e0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar52 * 0x60) = auVar110;
          uVar58 = vmovlps_avx(local_310);
          (&uStack_140)[uVar52 * 0xc] = uVar58;
          aiStack_138[uVar52 * 0x18] = local_9f4 + 1;
          uVar51 = uVar51 + 1;
        }
      }
    }
    do {
      uVar60 = uVar51;
      uVar59 = uVar60 - 1;
      if (uVar60 == 0) {
        if (bVar53 != false) {
          return bVar53;
        }
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar26._4_4_ = uVar138;
        auVar26._0_4_ = uVar138;
        auVar26._8_4_ = uVar138;
        auVar26._12_4_ = uVar138;
        uVar11 = vcmpps_avx512vl(local_320,auVar26,2);
        uVar54 = (uint)local_5e8 & (uint)uVar11;
        local_5e8 = (ulong)uVar54;
        if (uVar54 == 0) {
          return false;
        }
        goto LAB_01af4a4e;
      }
      uVar58 = (ulong)uVar59;
      lVar50 = uVar58 * 0x60;
      auVar73 = *(undefined1 (*) [32])(auStack_160 + lVar50);
      auVar150._0_4_ = fVar136 + auVar73._0_4_;
      auVar150._4_4_ = fVar154 + auVar73._4_4_;
      auVar150._8_4_ = fVar156 + auVar73._8_4_;
      auVar150._12_4_ = fVar158 + auVar73._12_4_;
      auVar150._16_4_ = fVar135 + auVar73._16_4_;
      auVar150._20_4_ = fVar160 + auVar73._20_4_;
      auVar150._24_4_ = fVar162 + auVar73._24_4_;
      auVar150._28_4_ = fVar164 + auVar73._28_4_;
      uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar138;
      auVar29._0_4_ = uVar138;
      auVar29._8_4_ = uVar138;
      auVar29._12_4_ = uVar138;
      auVar29._16_4_ = uVar138;
      auVar29._20_4_ = uVar138;
      auVar29._24_4_ = uVar138;
      auVar29._28_4_ = uVar138;
      uVar11 = vcmpps_avx512vl(auVar150,auVar29,2);
      uVar111 = (uint)uVar11 & (uint)abStack_180[lVar50];
      uVar51 = uVar59;
    } while (uVar111 == 0);
    uVar52 = (&uStack_140)[uVar58 * 0xc];
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar52;
    auVar188._8_4_ = 0x7f800000;
    auVar188._0_8_ = 0x7f8000007f800000;
    auVar188._12_4_ = 0x7f800000;
    auVar188._16_4_ = 0x7f800000;
    auVar188._20_4_ = 0x7f800000;
    auVar188._24_4_ = 0x7f800000;
    auVar188._28_4_ = 0x7f800000;
    auVar75 = vblendmps_avx512vl(auVar188,auVar73);
    bVar45 = (byte)uVar111;
    auVar106._0_4_ =
         (uint)(bVar45 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar45 & 1) * (int)auVar73._0_4_;
    bVar56 = (bool)((byte)(uVar111 >> 1) & 1);
    auVar106._4_4_ = (uint)bVar56 * auVar75._4_4_ | (uint)!bVar56 * (int)auVar73._4_4_;
    bVar56 = (bool)((byte)(uVar111 >> 2) & 1);
    auVar106._8_4_ = (uint)bVar56 * auVar75._8_4_ | (uint)!bVar56 * (int)auVar73._8_4_;
    bVar56 = (bool)((byte)(uVar111 >> 3) & 1);
    auVar106._12_4_ = (uint)bVar56 * auVar75._12_4_ | (uint)!bVar56 * (int)auVar73._12_4_;
    bVar56 = (bool)((byte)(uVar111 >> 4) & 1);
    auVar106._16_4_ = (uint)bVar56 * auVar75._16_4_ | (uint)!bVar56 * (int)auVar73._16_4_;
    bVar56 = (bool)((byte)(uVar111 >> 5) & 1);
    auVar106._20_4_ = (uint)bVar56 * auVar75._20_4_ | (uint)!bVar56 * (int)auVar73._20_4_;
    bVar56 = (bool)((byte)(uVar111 >> 6) & 1);
    auVar106._24_4_ = (uint)bVar56 * auVar75._24_4_ | (uint)!bVar56 * (int)auVar73._24_4_;
    auVar106._28_4_ =
         (uVar111 >> 7) * auVar75._28_4_ | (uint)!SUB41(uVar111 >> 7,0) * (int)auVar73._28_4_;
    auVar73 = vshufps_avx(auVar106,auVar106,0xb1);
    auVar73 = vminps_avx(auVar106,auVar73);
    auVar75 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vminps_avx(auVar73,auVar75);
    auVar75 = vpermpd_avx2(auVar73,0x4e);
    auVar73 = vminps_avx(auVar73,auVar75);
    uVar11 = vcmpps_avx512vl(auVar106,auVar73,0);
    bVar48 = (byte)uVar11 & bVar45;
    if (bVar48 != 0) {
      uVar111 = (uint)bVar48;
    }
    uVar112 = 0;
    for (; (uVar111 & 1) == 0; uVar111 = uVar111 >> 1 | 0x80000000) {
      uVar112 = uVar112 + 1;
    }
    local_9f4 = aiStack_138[uVar58 * 0x18];
    bVar45 = ~('\x01' << ((byte)uVar112 & 0x1f)) & bVar45;
    abStack_180[lVar50] = bVar45;
    uVar51 = uVar60;
    if (bVar45 == 0) {
      uVar51 = uVar59;
    }
    uVar138 = (undefined4)uVar52;
    auVar130._4_4_ = uVar138;
    auVar130._0_4_ = uVar138;
    auVar130._8_4_ = uVar138;
    auVar130._12_4_ = uVar138;
    auVar130._16_4_ = uVar138;
    auVar130._20_4_ = uVar138;
    auVar130._24_4_ = uVar138;
    auVar130._28_4_ = uVar138;
    auVar65 = vmovshdup_avx(auVar141);
    auVar65 = vsubps_avx(auVar65,auVar141);
    auVar151._0_4_ = auVar65._0_4_;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar151._16_4_ = auVar151._0_4_;
    auVar151._20_4_ = auVar151._0_4_;
    auVar151._24_4_ = auVar151._0_4_;
    auVar151._28_4_ = auVar151._0_4_;
    auVar65 = vfmadd132ps_fma(auVar151,auVar130,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar65);
    local_310._8_8_ = 0;
    local_310._0_8_ = *(ulong *)(local_460 + (ulong)uVar112 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }